

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O0

void initCMakeData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  initializer_list<std::pair<char,_QLatin1String>_> list_01;
  initializer_list<std::pair<char,_QLatin1String>_> list_02;
  QLatin1String local_6c68;
  char local_6c51;
  QLatin1String local_6c50;
  char local_6c39;
  QLatin1String local_6c38;
  char local_6c21;
  QLatin1String local_6c20;
  char local_6c09;
  QLatin1String local_6c08;
  char local_6bf1;
  QLatin1String local_6bf0;
  char local_6bd9;
  QLatin1String local_6bd8;
  char local_6bc1;
  QLatin1String local_6bc0;
  char local_6ba9;
  QLatin1String local_6ba8;
  char local_6b91;
  QLatin1String local_6b90;
  char local_6b79;
  QLatin1String local_6b78;
  char local_6b61;
  QLatin1String local_6b60;
  char local_6b49;
  QLatin1String local_6b48;
  char local_6b31;
  QLatin1String local_6b30;
  char local_6b19;
  QLatin1String local_6b18;
  char local_6b01;
  QLatin1String local_6b00;
  char local_6ae9;
  QLatin1String local_6ae8;
  char local_6ad1;
  QLatin1String local_6ad0;
  char local_6ab9;
  QLatin1String local_6ab8;
  char local_6aa1;
  QLatin1String local_6aa0;
  char local_6a89;
  QLatin1String local_6a88;
  char local_6a71;
  QLatin1String local_6a70;
  char local_6a59;
  QLatin1String local_6a58;
  char local_6a41;
  QLatin1String local_6a40;
  char local_6a29;
  QLatin1String local_6a28;
  char local_6a11;
  QLatin1String local_6a10;
  char local_69f9;
  QLatin1String local_69f8;
  char local_69e1;
  QLatin1String local_69e0;
  char local_69c9;
  QLatin1String local_69c8;
  char local_69b1;
  QLatin1String local_69b0;
  char local_6999;
  QLatin1String local_6998;
  char local_6981;
  QLatin1String local_6980;
  char local_6969;
  QLatin1String local_6968;
  char local_6951;
  QLatin1String local_6950;
  char local_6939;
  QLatin1String local_6938;
  char local_6921;
  QLatin1String local_6920;
  char local_6909;
  QLatin1String local_6908;
  char local_68f1;
  QLatin1String local_68f0;
  char local_68d9;
  QLatin1String local_68d8;
  char local_68c1;
  QLatin1String local_68c0;
  char local_68a9;
  QLatin1String local_68a8;
  char local_6891;
  QLatin1String local_6890;
  char local_6879;
  QLatin1String local_6878;
  char local_6861;
  QLatin1String local_6860;
  char local_6849;
  QLatin1String local_6848;
  char local_6831;
  QLatin1String local_6830;
  char local_6819;
  QLatin1String local_6818;
  char local_6801;
  QLatin1String local_6800;
  char local_67e9;
  QLatin1String local_67e8;
  char local_67d1;
  QLatin1String local_67d0;
  char local_67b9;
  QLatin1String local_67b8;
  char local_67a1;
  QLatin1String local_67a0;
  char local_6789;
  QLatin1String local_6788;
  char local_6771;
  QLatin1String local_6770;
  char local_6759;
  QLatin1String local_6758;
  char local_6741;
  QLatin1String local_6740;
  char local_6729;
  QLatin1String local_6728;
  char local_6711;
  QLatin1String local_6710;
  char local_66f9;
  QLatin1String local_66f8;
  char local_66e1;
  QLatin1String local_66e0;
  char local_66c9;
  QLatin1String local_66c8;
  char local_66b1;
  QLatin1String local_66b0;
  char local_6699;
  QLatin1String local_6698;
  char local_6681;
  QLatin1String local_6680;
  char local_6669;
  QLatin1String local_6668;
  char local_6651;
  QLatin1String local_6650;
  char local_6639;
  QLatin1String local_6638;
  char local_6621;
  QLatin1String local_6620;
  char local_6609;
  QLatin1String local_6608;
  char local_65f1;
  QLatin1String local_65f0;
  char local_65d9;
  QLatin1String local_65d8;
  char local_65c1;
  QLatin1String local_65c0;
  char local_65a9;
  QLatin1String local_65a8;
  char local_6591;
  QLatin1String local_6590;
  char local_6579;
  QLatin1String local_6578;
  char local_6561;
  QLatin1String local_6560;
  char local_6549;
  QLatin1String local_6548;
  char local_6531;
  QLatin1String local_6530;
  char local_6519;
  QLatin1String local_6518;
  char local_6501;
  QLatin1String local_6500;
  char local_64e9;
  QLatin1String local_64e8;
  char local_64d1;
  QLatin1String local_64d0;
  char local_64b9;
  QLatin1String local_64b8;
  char local_64a1;
  QLatin1String local_64a0;
  char local_6489;
  QLatin1String local_6488;
  char local_6471;
  QLatin1String local_6470;
  char local_6459;
  QLatin1String local_6458;
  char local_6441;
  QLatin1String local_6440;
  char local_6429;
  QLatin1String local_6428;
  char local_6411;
  QLatin1String local_6410;
  char local_63f9;
  QLatin1String local_63f8;
  char local_63e1;
  QLatin1String local_63e0;
  char local_63c9;
  QLatin1String local_63c8;
  char local_63b1;
  QLatin1String local_63b0;
  char local_6399;
  QLatin1String local_6398;
  char local_6381;
  QLatin1String local_6380;
  char local_6369;
  QLatin1String local_6368;
  char local_6351;
  QLatin1String local_6350;
  char local_6339;
  QLatin1String local_6338;
  char local_6321;
  QLatin1String local_6320;
  char local_6309;
  QLatin1String local_6308;
  char local_62f1;
  QLatin1String local_62f0;
  char local_62d9;
  QLatin1String local_62d8;
  char local_62c1;
  QLatin1String local_62c0;
  char local_62a9;
  QLatin1String local_62a8;
  char local_6291;
  QLatin1String local_6290;
  char local_6279;
  QLatin1String local_6278;
  char local_6261;
  QLatin1String local_6260;
  char local_6249;
  QLatin1String local_6248;
  char local_6231;
  QLatin1String local_6230;
  char local_6219;
  QLatin1String local_6218;
  char local_6201;
  QLatin1String local_6200;
  char local_61e9;
  QLatin1String local_61e8;
  char local_61d1;
  QLatin1String local_61d0;
  char local_61b9;
  QLatin1String local_61b8;
  char local_61a1;
  QLatin1String local_61a0;
  char local_6189;
  QLatin1String local_6188;
  char local_6171;
  QLatin1String local_6170;
  char local_6159;
  QLatin1String local_6158;
  char local_6141;
  QLatin1String local_6140;
  char local_6129;
  QLatin1String local_6128;
  char local_6111;
  QLatin1String local_6110;
  char local_60f9;
  QLatin1String local_60f8;
  char local_60e1;
  QLatin1String local_60e0;
  char local_60c9;
  QLatin1String local_60c8;
  char local_60b1;
  QLatin1String local_60b0;
  char local_6099;
  QLatin1String local_6098;
  char local_6081;
  QLatin1String local_6080;
  char local_6069;
  QLatin1String local_6068;
  char local_6051;
  QLatin1String local_6050;
  char local_6039;
  QLatin1String local_6038;
  char local_6021;
  QLatin1String local_6020;
  char local_6009;
  QLatin1String local_6008;
  char local_5ff1;
  QLatin1String local_5ff0;
  char local_5fd9;
  QLatin1String local_5fd8;
  char local_5fc1;
  QLatin1String local_5fc0;
  char local_5fa9;
  QLatin1String local_5fa8;
  char local_5f91;
  QLatin1String local_5f90;
  char local_5f79;
  QLatin1String local_5f78;
  char local_5f61;
  QLatin1String local_5f60;
  char local_5f49;
  QLatin1String local_5f48;
  char local_5f31;
  QLatin1String local_5f30;
  char local_5f19;
  QLatin1String local_5f18;
  char local_5f01;
  QLatin1String local_5f00;
  char local_5ee9;
  QLatin1String local_5ee8;
  char local_5ed1;
  QLatin1String local_5ed0;
  char local_5eb9;
  QLatin1String local_5eb8;
  char local_5ea1;
  QLatin1String local_5ea0;
  char local_5e89;
  QLatin1String local_5e88;
  char local_5e71;
  QLatin1String local_5e70;
  char local_5e59;
  QLatin1String local_5e58;
  char local_5e41;
  QLatin1String local_5e40;
  char local_5e29;
  QLatin1String local_5e28;
  char local_5e11;
  QLatin1String local_5e10;
  char local_5df9;
  QLatin1String local_5df8;
  char local_5de1;
  QLatin1String local_5de0;
  char local_5dc9;
  QLatin1String local_5dc8;
  char local_5db1;
  QLatin1String local_5db0;
  char local_5d99;
  QLatin1String local_5d98;
  char local_5d81;
  QLatin1String local_5d80;
  char local_5d69;
  QLatin1String local_5d68;
  char local_5d51;
  QLatin1String local_5d50;
  char local_5d39;
  QLatin1String local_5d38;
  char local_5d21;
  QLatin1String local_5d20;
  char local_5d09;
  QLatin1String local_5d08;
  char local_5cf1;
  QLatin1String local_5cf0;
  char local_5cd9;
  QLatin1String local_5cd8;
  char local_5cc1;
  QLatin1String local_5cc0;
  char local_5ca9;
  QLatin1String local_5ca8;
  char local_5c91;
  QLatin1String local_5c90;
  char local_5c79;
  QLatin1String local_5c78;
  char local_5c61;
  QLatin1String local_5c60;
  char local_5c49;
  QLatin1String local_5c48;
  char local_5c31;
  QLatin1String local_5c30;
  char local_5c19;
  QLatin1String local_5c18;
  char local_5c01;
  QLatin1String local_5c00;
  char local_5be9;
  QLatin1String local_5be8;
  char local_5bd1;
  QLatin1String local_5bd0;
  char local_5bb9;
  QLatin1String local_5bb8;
  char local_5ba1;
  QLatin1String local_5ba0;
  char local_5b89;
  QLatin1String local_5b88;
  char local_5b71;
  QLatin1String local_5b70;
  char local_5b59;
  QLatin1String local_5b58;
  char local_5b41;
  QLatin1String local_5b40;
  char local_5b29;
  QLatin1String local_5b28;
  char local_5b11;
  QLatin1String local_5b10;
  char local_5af9;
  QLatin1String local_5af8;
  char local_5ae1;
  QLatin1String local_5ae0;
  char local_5ac9;
  QLatin1String local_5ac8;
  char local_5ab1;
  QLatin1String local_5ab0;
  char local_5a99;
  QLatin1String local_5a98;
  char local_5a81;
  QLatin1String local_5a80;
  char local_5a69;
  QLatin1String local_5a68;
  char local_5a51;
  QLatin1String local_5a50;
  char local_5a39;
  QLatin1String local_5a38;
  char local_5a21;
  QLatin1String local_5a20;
  char local_5a09;
  QLatin1String local_5a08;
  char local_59f1;
  QLatin1String local_59f0;
  char local_59d9;
  QLatin1String local_59d8;
  char local_59c1;
  QLatin1String local_59c0;
  char local_59a9;
  QLatin1String local_59a8;
  char local_5991;
  QLatin1String local_5990;
  char local_5979;
  QLatin1String local_5978;
  char local_5961;
  QLatin1String local_5960;
  char local_5949;
  QLatin1String local_5948;
  char local_5931;
  pair<char,_QLatin1String> local_5930;
  pair<char,_QLatin1String> pStack_5918;
  pair<char,_QLatin1String> pStack_5900;
  pair<char,_QLatin1String> pStack_58e8;
  pair<char,_QLatin1String> pStack_58d0;
  pair<char,_QLatin1String> pStack_58b8;
  pair<char,_QLatin1String> pStack_58a0;
  pair<char,_QLatin1String> pStack_5888;
  pair<char,_QLatin1String> pStack_5870;
  pair<char,_QLatin1String> pStack_5858;
  pair<char,_QLatin1String> pStack_5840;
  pair<char,_QLatin1String> pStack_5828;
  pair<char,_QLatin1String> pStack_5810;
  pair<char,_QLatin1String> pStack_57f8;
  pair<char,_QLatin1String> pStack_57e0;
  pair<char,_QLatin1String> pStack_57c8;
  pair<char,_QLatin1String> pStack_57b0;
  pair<char,_QLatin1String> pStack_5798;
  pair<char,_QLatin1String> pStack_5780;
  pair<char,_QLatin1String> pStack_5768;
  pair<char,_QLatin1String> pStack_5750;
  pair<char,_QLatin1String> pStack_5738;
  pair<char,_QLatin1String> pStack_5720;
  pair<char,_QLatin1String> pStack_5708;
  pair<char,_QLatin1String> pStack_56f0;
  pair<char,_QLatin1String> pStack_56d8;
  pair<char,_QLatin1String> pStack_56c0;
  pair<char,_QLatin1String> pStack_56a8;
  pair<char,_QLatin1String> pStack_5690;
  pair<char,_QLatin1String> pStack_5678;
  pair<char,_QLatin1String> pStack_5660;
  pair<char,_QLatin1String> pStack_5648;
  pair<char,_QLatin1String> pStack_5630;
  pair<char,_QLatin1String> pStack_5618;
  pair<char,_QLatin1String> pStack_5600;
  pair<char,_QLatin1String> pStack_55e8;
  pair<char,_QLatin1String> pStack_55d0;
  pair<char,_QLatin1String> pStack_55b8;
  pair<char,_QLatin1String> pStack_55a0;
  pair<char,_QLatin1String> pStack_5588;
  pair<char,_QLatin1String> pStack_5570;
  pair<char,_QLatin1String> pStack_5558;
  pair<char,_QLatin1String> pStack_5540;
  pair<char,_QLatin1String> pStack_5528;
  pair<char,_QLatin1String> pStack_5510;
  pair<char,_QLatin1String> pStack_54f8;
  pair<char,_QLatin1String> pStack_54e0;
  pair<char,_QLatin1String> pStack_54c8;
  pair<char,_QLatin1String> pStack_54b0;
  pair<char,_QLatin1String> pStack_5498;
  pair<char,_QLatin1String> pStack_5480;
  pair<char,_QLatin1String> pStack_5468;
  pair<char,_QLatin1String> pStack_5450;
  pair<char,_QLatin1String> pStack_5438;
  pair<char,_QLatin1String> pStack_5420;
  pair<char,_QLatin1String> pStack_5408;
  pair<char,_QLatin1String> pStack_53f0;
  pair<char,_QLatin1String> pStack_53d8;
  pair<char,_QLatin1String> pStack_53c0;
  pair<char,_QLatin1String> pStack_53a8;
  pair<char,_QLatin1String> pStack_5390;
  pair<char,_QLatin1String> pStack_5378;
  pair<char,_QLatin1String> pStack_5360;
  pair<char,_QLatin1String> pStack_5348;
  pair<char,_QLatin1String> pStack_5330;
  pair<char,_QLatin1String> pStack_5318;
  pair<char,_QLatin1String> pStack_5300;
  pair<char,_QLatin1String> pStack_52e8;
  pair<char,_QLatin1String> pStack_52d0;
  pair<char,_QLatin1String> pStack_52b8;
  pair<char,_QLatin1String> pStack_52a0;
  pair<char,_QLatin1String> pStack_5288;
  pair<char,_QLatin1String> pStack_5270;
  pair<char,_QLatin1String> pStack_5258;
  pair<char,_QLatin1String> pStack_5240;
  pair<char,_QLatin1String> pStack_5228;
  pair<char,_QLatin1String> pStack_5210;
  pair<char,_QLatin1String> pStack_51f8;
  pair<char,_QLatin1String> pStack_51e0;
  pair<char,_QLatin1String> pStack_51c8;
  pair<char,_QLatin1String> pStack_51b0;
  pair<char,_QLatin1String> pStack_5198;
  pair<char,_QLatin1String> pStack_5180;
  pair<char,_QLatin1String> pStack_5168;
  pair<char,_QLatin1String> pStack_5150;
  pair<char,_QLatin1String> pStack_5138;
  pair<char,_QLatin1String> pStack_5120;
  pair<char,_QLatin1String> pStack_5108;
  pair<char,_QLatin1String> pStack_50f0;
  pair<char,_QLatin1String> pStack_50d8;
  pair<char,_QLatin1String> pStack_50c0;
  pair<char,_QLatin1String> pStack_50a8;
  pair<char,_QLatin1String> pStack_5090;
  pair<char,_QLatin1String> pStack_5078;
  pair<char,_QLatin1String> pStack_5060;
  pair<char,_QLatin1String> pStack_5048;
  pair<char,_QLatin1String> pStack_5030;
  pair<char,_QLatin1String> pStack_5018;
  pair<char,_QLatin1String> pStack_5000;
  pair<char,_QLatin1String> pStack_4fe8;
  pair<char,_QLatin1String> pStack_4fd0;
  pair<char,_QLatin1String> pStack_4fb8;
  pair<char,_QLatin1String> pStack_4fa0;
  pair<char,_QLatin1String> pStack_4f88;
  pair<char,_QLatin1String> pStack_4f70;
  pair<char,_QLatin1String> pStack_4f58;
  pair<char,_QLatin1String> pStack_4f40;
  pair<char,_QLatin1String> pStack_4f28;
  pair<char,_QLatin1String> pStack_4f10;
  pair<char,_QLatin1String> pStack_4ef8;
  pair<char,_QLatin1String> pStack_4ee0;
  pair<char,_QLatin1String> pStack_4ec8;
  pair<char,_QLatin1String> pStack_4eb0;
  pair<char,_QLatin1String> pStack_4e98;
  pair<char,_QLatin1String> pStack_4e80;
  pair<char,_QLatin1String> pStack_4e68;
  pair<char,_QLatin1String> pStack_4e50;
  pair<char,_QLatin1String> pStack_4e38;
  pair<char,_QLatin1String> pStack_4e20;
  pair<char,_QLatin1String> pStack_4e08;
  pair<char,_QLatin1String> pStack_4df0;
  pair<char,_QLatin1String> pStack_4dd8;
  pair<char,_QLatin1String> pStack_4dc0;
  pair<char,_QLatin1String> pStack_4da8;
  pair<char,_QLatin1String> pStack_4d90;
  pair<char,_QLatin1String> pStack_4d78;
  pair<char,_QLatin1String> pStack_4d60;
  pair<char,_QLatin1String> pStack_4d48;
  pair<char,_QLatin1String> pStack_4d30;
  pair<char,_QLatin1String> pStack_4d18;
  pair<char,_QLatin1String> pStack_4d00;
  pair<char,_QLatin1String> pStack_4ce8;
  pair<char,_QLatin1String> pStack_4cd0;
  pair<char,_QLatin1String> pStack_4cb8;
  pair<char,_QLatin1String> pStack_4ca0;
  pair<char,_QLatin1String> pStack_4c88;
  pair<char,_QLatin1String> pStack_4c70;
  pair<char,_QLatin1String> pStack_4c58;
  pair<char,_QLatin1String> pStack_4c40;
  pair<char,_QLatin1String> pStack_4c28;
  pair<char,_QLatin1String> pStack_4c10;
  pair<char,_QLatin1String> pStack_4bf8;
  pair<char,_QLatin1String> pStack_4be0;
  pair<char,_QLatin1String> pStack_4bc8;
  pair<char,_QLatin1String> pStack_4bb0;
  pair<char,_QLatin1String> pStack_4b98;
  pair<char,_QLatin1String> pStack_4b80;
  pair<char,_QLatin1String> pStack_4b68;
  pair<char,_QLatin1String> pStack_4b50;
  pair<char,_QLatin1String> pStack_4b38;
  pair<char,_QLatin1String> pStack_4b20;
  pair<char,_QLatin1String> pStack_4b08;
  pair<char,_QLatin1String> pStack_4af0;
  pair<char,_QLatin1String> pStack_4ad8;
  pair<char,_QLatin1String> pStack_4ac0;
  pair<char,_QLatin1String> pStack_4aa8;
  pair<char,_QLatin1String> pStack_4a90;
  pair<char,_QLatin1String> pStack_4a78;
  pair<char,_QLatin1String> pStack_4a60;
  pair<char,_QLatin1String> pStack_4a48;
  pair<char,_QLatin1String> pStack_4a30;
  pair<char,_QLatin1String> pStack_4a18;
  pair<char,_QLatin1String> pStack_4a00;
  pair<char,_QLatin1String> pStack_49e8;
  pair<char,_QLatin1String> pStack_49d0;
  pair<char,_QLatin1String> pStack_49b8;
  pair<char,_QLatin1String> pStack_49a0;
  pair<char,_QLatin1String> pStack_4988;
  pair<char,_QLatin1String> pStack_4970;
  pair<char,_QLatin1String> pStack_4958;
  pair<char,_QLatin1String> pStack_4940;
  pair<char,_QLatin1String> pStack_4928;
  pair<char,_QLatin1String> pStack_4910;
  pair<char,_QLatin1String> pStack_48f8;
  pair<char,_QLatin1String> pStack_48e0;
  pair<char,_QLatin1String> pStack_48c8;
  pair<char,_QLatin1String> pStack_48b0;
  pair<char,_QLatin1String> pStack_4898;
  pair<char,_QLatin1String> pStack_4880;
  pair<char,_QLatin1String> pStack_4868;
  pair<char,_QLatin1String> pStack_4850;
  pair<char,_QLatin1String> pStack_4838;
  pair<char,_QLatin1String> pStack_4820;
  pair<char,_QLatin1String> pStack_4808;
  pair<char,_QLatin1String> pStack_47f0;
  pair<char,_QLatin1String> pStack_47d8;
  pair<char,_QLatin1String> pStack_47c0;
  pair<char,_QLatin1String> pStack_47a8;
  pair<char,_QLatin1String> pStack_4790;
  pair<char,_QLatin1String> pStack_4778;
  pair<char,_QLatin1String> pStack_4760;
  pair<char,_QLatin1String> pStack_4748;
  pair<char,_QLatin1String> pStack_4730;
  pair<char,_QLatin1String> pStack_4718;
  pair<char,_QLatin1String> pStack_4700;
  pair<char,_QLatin1String> pStack_46e8;
  pair<char,_QLatin1String> pStack_46d0;
  pair<char,_QLatin1String> pStack_46b8;
  pair<char,_QLatin1String> pStack_46a0;
  pair<char,_QLatin1String> pStack_4688;
  pair<char,_QLatin1String> pStack_4670;
  pair<char,_QLatin1String> pStack_4658;
  pair<char,_QLatin1String> pStack_4640;
  pair<char,_QLatin1String> pStack_4628;
  pair<char,_QLatin1String> pStack_4610;
  iterator local_45f8;
  undefined8 local_45f0;
  QMultiHash<char,_QLatin1String> local_45e8;
  QLatin1String local_45d8;
  char local_45c1;
  QLatin1String local_45c0;
  char local_45a9;
  QLatin1String local_45a8;
  char local_4591;
  QLatin1String local_4590;
  char local_4579;
  QLatin1String local_4578;
  char local_4561;
  QLatin1String local_4560;
  char local_4549;
  QLatin1String local_4548;
  char local_4531;
  QLatin1String local_4530;
  char local_4519;
  QLatin1String local_4518;
  char local_4501;
  QLatin1String local_4500;
  char local_44e9;
  QLatin1String local_44e8;
  char local_44d1;
  QLatin1String local_44d0;
  char local_44b9;
  QLatin1String local_44b8;
  char local_44a1;
  QLatin1String local_44a0;
  char local_4489;
  QLatin1String local_4488;
  char local_4471;
  QLatin1String local_4470;
  char local_4459;
  QLatin1String local_4458;
  char local_4441;
  QLatin1String local_4440;
  char local_4429;
  QLatin1String local_4428;
  char local_4411;
  QLatin1String local_4410;
  char local_43f9;
  QLatin1String local_43f8;
  char local_43e1;
  QLatin1String local_43e0;
  char local_43c9;
  QLatin1String local_43c8;
  char local_43b1;
  QLatin1String local_43b0;
  char local_4399;
  QLatin1String local_4398;
  char local_4381;
  QLatin1String local_4380;
  char local_4369;
  QLatin1String local_4368;
  char local_4351;
  QLatin1String local_4350;
  char local_4339;
  QLatin1String local_4338;
  char local_4321;
  QLatin1String local_4320;
  char local_4309;
  QLatin1String local_4308;
  char local_42f1;
  QLatin1String local_42f0;
  char local_42d9;
  QLatin1String local_42d8;
  char local_42c1;
  QLatin1String local_42c0;
  char local_42a9;
  QLatin1String local_42a8;
  char local_4291;
  QLatin1String local_4290;
  char local_4279;
  QLatin1String local_4278;
  char local_4261;
  QLatin1String local_4260;
  char local_4249;
  QLatin1String local_4248;
  char local_4231;
  QLatin1String local_4230;
  char local_4219;
  QLatin1String local_4218;
  char local_4201;
  QLatin1String local_4200;
  char local_41e9;
  QLatin1String local_41e8;
  char local_41d1;
  QLatin1String local_41d0;
  char local_41b9;
  QLatin1String local_41b8;
  char local_41a1;
  QLatin1String local_41a0;
  char local_4189;
  QLatin1String local_4188;
  char local_4171;
  QLatin1String local_4170;
  char local_4159;
  QLatin1String local_4158;
  char local_4141;
  QLatin1String local_4140;
  char local_4129;
  QLatin1String local_4128;
  char local_4111;
  QLatin1String local_4110;
  char local_40f9;
  QLatin1String local_40f8;
  char local_40e1;
  QLatin1String local_40e0;
  char local_40c9;
  QLatin1String local_40c8;
  char local_40b1;
  QLatin1String local_40b0;
  char local_4099;
  QLatin1String local_4098;
  char local_4081;
  QLatin1String local_4080;
  char local_4069;
  QLatin1String local_4068;
  char local_4051;
  QLatin1String local_4050;
  char local_4039;
  QLatin1String local_4038;
  char local_4021;
  QLatin1String local_4020;
  char local_4009;
  QLatin1String local_4008;
  char local_3ff1;
  QLatin1String local_3ff0;
  char local_3fd9;
  QLatin1String local_3fd8;
  char local_3fc1;
  QLatin1String local_3fc0;
  char local_3fa9;
  QLatin1String local_3fa8;
  char local_3f91;
  QLatin1String local_3f90;
  char local_3f79;
  QLatin1String local_3f78;
  char local_3f61;
  QLatin1String local_3f60;
  char local_3f49;
  QLatin1String local_3f48;
  char local_3f31;
  QLatin1String local_3f30;
  char local_3f19;
  QLatin1String local_3f18;
  char local_3f01;
  QLatin1String local_3f00;
  char local_3ee9;
  QLatin1String local_3ee8;
  char local_3ed1;
  QLatin1String local_3ed0;
  char local_3eb9;
  QLatin1String local_3eb8;
  char local_3ea1;
  QLatin1String local_3ea0;
  char local_3e89;
  QLatin1String local_3e88;
  char local_3e71;
  QLatin1String local_3e70;
  char local_3e59;
  QLatin1String local_3e58;
  char local_3e41;
  QLatin1String local_3e40;
  char local_3e29;
  QLatin1String local_3e28;
  char local_3e11;
  QLatin1String local_3e10;
  char local_3df9;
  QLatin1String local_3df8;
  char local_3de1;
  QLatin1String local_3de0;
  char local_3dc9;
  QLatin1String local_3dc8;
  char local_3db1;
  QLatin1String local_3db0;
  char local_3d99;
  QLatin1String local_3d98;
  char local_3d81;
  QLatin1String local_3d80;
  char local_3d69;
  QLatin1String local_3d68;
  char local_3d51;
  QLatin1String local_3d50;
  char local_3d39;
  QLatin1String local_3d38;
  char local_3d21;
  QLatin1String local_3d20;
  char local_3d09;
  QLatin1String local_3d08;
  char local_3cf1;
  QLatin1String local_3cf0;
  char local_3cd9;
  QLatin1String local_3cd8;
  char local_3cc1;
  QLatin1String local_3cc0;
  char local_3ca9;
  QLatin1String local_3ca8;
  char local_3c91;
  QLatin1String local_3c90;
  char local_3c79;
  QLatin1String local_3c78;
  char local_3c61;
  QLatin1String local_3c60;
  char local_3c49;
  QLatin1String local_3c48;
  char local_3c31;
  QLatin1String local_3c30;
  char local_3c19;
  QLatin1String local_3c18;
  char local_3c01;
  QLatin1String local_3c00;
  char local_3be9;
  QLatin1String local_3be8;
  char local_3bd1;
  QLatin1String local_3bd0;
  char local_3bb9;
  QLatin1String local_3bb8;
  char local_3ba1;
  QLatin1String local_3ba0;
  char local_3b89;
  QLatin1String local_3b88;
  char local_3b71;
  QLatin1String local_3b70;
  char local_3b59;
  QLatin1String local_3b58;
  char local_3b41;
  QLatin1String local_3b40;
  char local_3b29;
  QLatin1String local_3b28;
  char local_3b11;
  QLatin1String local_3b10;
  char local_3af9;
  QLatin1String local_3af8;
  char local_3ae1;
  QLatin1String local_3ae0;
  char local_3ac9;
  QLatin1String local_3ac8;
  char local_3ab1;
  QLatin1String local_3ab0;
  char local_3a99;
  QLatin1String local_3a98;
  char local_3a81;
  QLatin1String local_3a80;
  char local_3a69;
  QLatin1String local_3a68;
  char local_3a51;
  QLatin1String local_3a50;
  char local_3a39;
  QLatin1String local_3a38;
  char local_3a21;
  QLatin1String local_3a20;
  char local_3a09;
  QLatin1String local_3a08;
  char local_39f1;
  QLatin1String local_39f0;
  char local_39d9;
  QLatin1String local_39d8;
  char local_39c1;
  QLatin1String local_39c0;
  char local_39a9;
  QLatin1String local_39a8;
  char local_3991;
  QLatin1String local_3990;
  char local_3979;
  QLatin1String local_3978;
  char local_3961;
  QLatin1String local_3960;
  char local_3949;
  QLatin1String local_3948;
  char local_3931;
  QLatin1String local_3930;
  char local_3919;
  QLatin1String local_3918;
  char local_3901;
  QLatin1String local_3900;
  char local_38e9;
  QLatin1String local_38e8;
  char local_38d1;
  QLatin1String local_38d0;
  char local_38b9;
  QLatin1String local_38b8;
  char local_38a1;
  QLatin1String local_38a0;
  char local_3889;
  QLatin1String local_3888;
  char local_3871;
  QLatin1String local_3870;
  char local_3859;
  QLatin1String local_3858;
  char local_3841;
  QLatin1String local_3840;
  char local_3829;
  QLatin1String local_3828;
  char local_3811;
  QLatin1String local_3810;
  char local_37f9;
  QLatin1String local_37f8;
  char local_37e1;
  QLatin1String local_37e0;
  char local_37c9;
  QLatin1String local_37c8;
  char local_37b1;
  QLatin1String local_37b0;
  char local_3799;
  QLatin1String local_3798;
  char local_3781;
  QLatin1String local_3780;
  char local_3769;
  QLatin1String local_3768;
  char local_3751;
  QLatin1String local_3750;
  char local_3739;
  QLatin1String local_3738;
  char local_3721;
  QLatin1String local_3720;
  char local_3709;
  QLatin1String local_3708;
  char local_36f1;
  QLatin1String local_36f0;
  char local_36d9;
  QLatin1String local_36d8;
  char local_36c1;
  QLatin1String local_36c0;
  char local_36a9;
  QLatin1String local_36a8;
  char local_3691;
  QLatin1String local_3690;
  char local_3679;
  QLatin1String local_3678;
  char local_3661;
  QLatin1String local_3660;
  char local_3649;
  QLatin1String local_3648;
  char local_3631;
  QLatin1String local_3630;
  char local_3619;
  QLatin1String local_3618;
  char local_3601;
  QLatin1String local_3600;
  char local_35e9;
  QLatin1String local_35e8;
  char local_35d1;
  QLatin1String local_35d0;
  char local_35b9;
  QLatin1String local_35b8;
  char local_35a1;
  QLatin1String local_35a0;
  char local_3589;
  QLatin1String local_3588;
  char local_3571;
  QLatin1String local_3570;
  char local_3559;
  QLatin1String local_3558;
  char local_3541;
  QLatin1String local_3540;
  char local_3529;
  QLatin1String local_3528;
  char local_3511;
  QLatin1String local_3510;
  char local_34f9;
  QLatin1String local_34f8;
  char local_34e1;
  QLatin1String local_34e0;
  char local_34c9;
  QLatin1String local_34c8;
  char local_34b1;
  QLatin1String local_34b0;
  char local_3499;
  QLatin1String local_3498;
  char local_3481;
  QLatin1String local_3480;
  char local_3469;
  QLatin1String local_3468;
  char local_3451;
  QLatin1String local_3450;
  char local_3439;
  QLatin1String local_3438;
  char local_3421;
  QLatin1String local_3420;
  char local_3409;
  QLatin1String local_3408;
  char local_33f1;
  QLatin1String local_33f0;
  char local_33d9;
  QLatin1String local_33d8;
  char local_33c1;
  QLatin1String local_33c0;
  char local_33a9;
  QLatin1String local_33a8;
  char local_3391;
  QLatin1String local_3390;
  char local_3379;
  QLatin1String local_3378;
  char local_3361;
  QLatin1String local_3360;
  char local_3349;
  QLatin1String local_3348;
  char local_3331;
  QLatin1String local_3330;
  char local_3319;
  QLatin1String local_3318;
  char local_3301;
  QLatin1String local_3300;
  char local_32e9;
  QLatin1String local_32e8;
  char local_32d1;
  QLatin1String local_32d0;
  char local_32b9;
  QLatin1String local_32b8;
  char local_32a1;
  QLatin1String local_32a0;
  char local_3289;
  pair<char,_QLatin1String> local_3288;
  pair<char,_QLatin1String> pStack_3270;
  pair<char,_QLatin1String> pStack_3258;
  pair<char,_QLatin1String> pStack_3240;
  pair<char,_QLatin1String> pStack_3228;
  pair<char,_QLatin1String> pStack_3210;
  pair<char,_QLatin1String> pStack_31f8;
  pair<char,_QLatin1String> pStack_31e0;
  pair<char,_QLatin1String> pStack_31c8;
  pair<char,_QLatin1String> pStack_31b0;
  pair<char,_QLatin1String> pStack_3198;
  pair<char,_QLatin1String> pStack_3180;
  pair<char,_QLatin1String> pStack_3168;
  pair<char,_QLatin1String> pStack_3150;
  pair<char,_QLatin1String> pStack_3138;
  pair<char,_QLatin1String> pStack_3120;
  pair<char,_QLatin1String> pStack_3108;
  pair<char,_QLatin1String> pStack_30f0;
  pair<char,_QLatin1String> pStack_30d8;
  pair<char,_QLatin1String> pStack_30c0;
  pair<char,_QLatin1String> pStack_30a8;
  pair<char,_QLatin1String> pStack_3090;
  pair<char,_QLatin1String> pStack_3078;
  pair<char,_QLatin1String> pStack_3060;
  pair<char,_QLatin1String> pStack_3048;
  pair<char,_QLatin1String> pStack_3030;
  pair<char,_QLatin1String> pStack_3018;
  pair<char,_QLatin1String> pStack_3000;
  pair<char,_QLatin1String> pStack_2fe8;
  pair<char,_QLatin1String> pStack_2fd0;
  pair<char,_QLatin1String> pStack_2fb8;
  pair<char,_QLatin1String> pStack_2fa0;
  pair<char,_QLatin1String> pStack_2f88;
  pair<char,_QLatin1String> pStack_2f70;
  pair<char,_QLatin1String> pStack_2f58;
  pair<char,_QLatin1String> pStack_2f40;
  pair<char,_QLatin1String> pStack_2f28;
  pair<char,_QLatin1String> pStack_2f10;
  pair<char,_QLatin1String> pStack_2ef8;
  pair<char,_QLatin1String> pStack_2ee0;
  pair<char,_QLatin1String> pStack_2ec8;
  pair<char,_QLatin1String> pStack_2eb0;
  pair<char,_QLatin1String> pStack_2e98;
  pair<char,_QLatin1String> pStack_2e80;
  pair<char,_QLatin1String> pStack_2e68;
  pair<char,_QLatin1String> pStack_2e50;
  pair<char,_QLatin1String> pStack_2e38;
  pair<char,_QLatin1String> pStack_2e20;
  pair<char,_QLatin1String> pStack_2e08;
  pair<char,_QLatin1String> pStack_2df0;
  pair<char,_QLatin1String> pStack_2dd8;
  pair<char,_QLatin1String> pStack_2dc0;
  pair<char,_QLatin1String> pStack_2da8;
  pair<char,_QLatin1String> pStack_2d90;
  pair<char,_QLatin1String> pStack_2d78;
  pair<char,_QLatin1String> pStack_2d60;
  pair<char,_QLatin1String> pStack_2d48;
  pair<char,_QLatin1String> pStack_2d30;
  pair<char,_QLatin1String> pStack_2d18;
  pair<char,_QLatin1String> pStack_2d00;
  pair<char,_QLatin1String> pStack_2ce8;
  pair<char,_QLatin1String> pStack_2cd0;
  pair<char,_QLatin1String> pStack_2cb8;
  pair<char,_QLatin1String> pStack_2ca0;
  pair<char,_QLatin1String> pStack_2c88;
  pair<char,_QLatin1String> pStack_2c70;
  pair<char,_QLatin1String> pStack_2c58;
  pair<char,_QLatin1String> pStack_2c40;
  pair<char,_QLatin1String> pStack_2c28;
  pair<char,_QLatin1String> pStack_2c10;
  pair<char,_QLatin1String> pStack_2bf8;
  pair<char,_QLatin1String> pStack_2be0;
  pair<char,_QLatin1String> pStack_2bc8;
  pair<char,_QLatin1String> pStack_2bb0;
  pair<char,_QLatin1String> pStack_2b98;
  pair<char,_QLatin1String> pStack_2b80;
  pair<char,_QLatin1String> pStack_2b68;
  pair<char,_QLatin1String> pStack_2b50;
  pair<char,_QLatin1String> pStack_2b38;
  pair<char,_QLatin1String> pStack_2b20;
  pair<char,_QLatin1String> pStack_2b08;
  pair<char,_QLatin1String> pStack_2af0;
  pair<char,_QLatin1String> pStack_2ad8;
  pair<char,_QLatin1String> pStack_2ac0;
  pair<char,_QLatin1String> pStack_2aa8;
  pair<char,_QLatin1String> pStack_2a90;
  pair<char,_QLatin1String> pStack_2a78;
  pair<char,_QLatin1String> pStack_2a60;
  pair<char,_QLatin1String> pStack_2a48;
  pair<char,_QLatin1String> pStack_2a30;
  pair<char,_QLatin1String> pStack_2a18;
  pair<char,_QLatin1String> pStack_2a00;
  pair<char,_QLatin1String> pStack_29e8;
  pair<char,_QLatin1String> pStack_29d0;
  pair<char,_QLatin1String> pStack_29b8;
  pair<char,_QLatin1String> pStack_29a0;
  pair<char,_QLatin1String> pStack_2988;
  pair<char,_QLatin1String> pStack_2970;
  pair<char,_QLatin1String> pStack_2958;
  pair<char,_QLatin1String> pStack_2940;
  pair<char,_QLatin1String> pStack_2928;
  pair<char,_QLatin1String> pStack_2910;
  pair<char,_QLatin1String> pStack_28f8;
  pair<char,_QLatin1String> pStack_28e0;
  pair<char,_QLatin1String> pStack_28c8;
  pair<char,_QLatin1String> pStack_28b0;
  pair<char,_QLatin1String> pStack_2898;
  pair<char,_QLatin1String> pStack_2880;
  pair<char,_QLatin1String> pStack_2868;
  pair<char,_QLatin1String> pStack_2850;
  pair<char,_QLatin1String> pStack_2838;
  pair<char,_QLatin1String> pStack_2820;
  pair<char,_QLatin1String> pStack_2808;
  pair<char,_QLatin1String> pStack_27f0;
  pair<char,_QLatin1String> pStack_27d8;
  pair<char,_QLatin1String> pStack_27c0;
  pair<char,_QLatin1String> pStack_27a8;
  pair<char,_QLatin1String> pStack_2790;
  pair<char,_QLatin1String> pStack_2778;
  pair<char,_QLatin1String> pStack_2760;
  pair<char,_QLatin1String> pStack_2748;
  pair<char,_QLatin1String> pStack_2730;
  pair<char,_QLatin1String> pStack_2718;
  pair<char,_QLatin1String> pStack_2700;
  pair<char,_QLatin1String> pStack_26e8;
  pair<char,_QLatin1String> pStack_26d0;
  pair<char,_QLatin1String> pStack_26b8;
  pair<char,_QLatin1String> pStack_26a0;
  pair<char,_QLatin1String> pStack_2688;
  pair<char,_QLatin1String> pStack_2670;
  pair<char,_QLatin1String> pStack_2658;
  pair<char,_QLatin1String> pStack_2640;
  pair<char,_QLatin1String> pStack_2628;
  pair<char,_QLatin1String> pStack_2610;
  pair<char,_QLatin1String> pStack_25f8;
  pair<char,_QLatin1String> pStack_25e0;
  pair<char,_QLatin1String> pStack_25c8;
  pair<char,_QLatin1String> pStack_25b0;
  pair<char,_QLatin1String> pStack_2598;
  pair<char,_QLatin1String> pStack_2580;
  pair<char,_QLatin1String> pStack_2568;
  pair<char,_QLatin1String> pStack_2550;
  pair<char,_QLatin1String> pStack_2538;
  pair<char,_QLatin1String> pStack_2520;
  pair<char,_QLatin1String> pStack_2508;
  pair<char,_QLatin1String> pStack_24f0;
  pair<char,_QLatin1String> pStack_24d8;
  pair<char,_QLatin1String> pStack_24c0;
  pair<char,_QLatin1String> pStack_24a8;
  pair<char,_QLatin1String> pStack_2490;
  pair<char,_QLatin1String> pStack_2478;
  pair<char,_QLatin1String> pStack_2460;
  pair<char,_QLatin1String> pStack_2448;
  pair<char,_QLatin1String> pStack_2430;
  pair<char,_QLatin1String> pStack_2418;
  pair<char,_QLatin1String> pStack_2400;
  pair<char,_QLatin1String> pStack_23e8;
  pair<char,_QLatin1String> pStack_23d0;
  pair<char,_QLatin1String> pStack_23b8;
  pair<char,_QLatin1String> pStack_23a0;
  pair<char,_QLatin1String> pStack_2388;
  pair<char,_QLatin1String> pStack_2370;
  pair<char,_QLatin1String> pStack_2358;
  pair<char,_QLatin1String> pStack_2340;
  pair<char,_QLatin1String> pStack_2328;
  pair<char,_QLatin1String> pStack_2310;
  pair<char,_QLatin1String> pStack_22f8;
  pair<char,_QLatin1String> pStack_22e0;
  pair<char,_QLatin1String> pStack_22c8;
  pair<char,_QLatin1String> pStack_22b0;
  pair<char,_QLatin1String> pStack_2298;
  pair<char,_QLatin1String> pStack_2280;
  pair<char,_QLatin1String> pStack_2268;
  pair<char,_QLatin1String> pStack_2250;
  pair<char,_QLatin1String> pStack_2238;
  pair<char,_QLatin1String> pStack_2220;
  pair<char,_QLatin1String> pStack_2208;
  pair<char,_QLatin1String> pStack_21f0;
  pair<char,_QLatin1String> pStack_21d8;
  pair<char,_QLatin1String> pStack_21c0;
  pair<char,_QLatin1String> pStack_21a8;
  pair<char,_QLatin1String> pStack_2190;
  pair<char,_QLatin1String> pStack_2178;
  pair<char,_QLatin1String> pStack_2160;
  pair<char,_QLatin1String> pStack_2148;
  pair<char,_QLatin1String> pStack_2130;
  pair<char,_QLatin1String> pStack_2118;
  pair<char,_QLatin1String> pStack_2100;
  pair<char,_QLatin1String> pStack_20e8;
  pair<char,_QLatin1String> pStack_20d0;
  pair<char,_QLatin1String> pStack_20b8;
  pair<char,_QLatin1String> pStack_20a0;
  pair<char,_QLatin1String> pStack_2088;
  pair<char,_QLatin1String> pStack_2070;
  pair<char,_QLatin1String> pStack_2058;
  pair<char,_QLatin1String> pStack_2040;
  pair<char,_QLatin1String> pStack_2028;
  pair<char,_QLatin1String> pStack_2010;
  pair<char,_QLatin1String> pStack_1ff8;
  pair<char,_QLatin1String> pStack_1fe0;
  pair<char,_QLatin1String> pStack_1fc8;
  pair<char,_QLatin1String> pStack_1fb0;
  pair<char,_QLatin1String> pStack_1f98;
  pair<char,_QLatin1String> pStack_1f80;
  pair<char,_QLatin1String> pStack_1f68;
  pair<char,_QLatin1String> pStack_1f50;
  iterator local_1f38;
  undefined8 local_1f30;
  QMultiHash<char,_QLatin1String> local_1f28;
  QLatin1String local_1f18;
  char local_1f01;
  QLatin1String local_1f00;
  char local_1ee9;
  QLatin1String local_1ee8;
  char local_1ed1;
  QLatin1String local_1ed0;
  char local_1eb9;
  QLatin1String local_1eb8;
  char local_1ea1;
  QLatin1String local_1ea0;
  char local_1e89;
  QLatin1String local_1e88;
  char local_1e71;
  QLatin1String local_1e70;
  char local_1e59;
  pair<char,_QLatin1String> local_1e58;
  pair<char,_QLatin1String> pStack_1e40;
  pair<char,_QLatin1String> pStack_1e28;
  pair<char,_QLatin1String> pStack_1e10;
  pair<char,_QLatin1String> pStack_1df8;
  pair<char,_QLatin1String> pStack_1de0;
  pair<char,_QLatin1String> pStack_1dc8;
  pair<char,_QLatin1String> pStack_1db0;
  iterator local_1d98;
  undefined8 local_1d90;
  QMultiHash<char,_QLatin1String> local_1d88;
  QMultiHash<char,_QLatin1String> local_1d78;
  QLatin1String local_1d68;
  char local_1d51;
  QLatin1String local_1d50;
  char local_1d39;
  QLatin1String local_1d38;
  char local_1d21;
  QLatin1String local_1d20;
  char local_1d09;
  QLatin1String local_1d08;
  char local_1cf1;
  QLatin1String local_1cf0;
  char local_1cd9;
  QLatin1String local_1cd8;
  char local_1cc1;
  QLatin1String local_1cc0;
  char local_1ca9;
  QLatin1String local_1ca8;
  char local_1c91;
  QLatin1String local_1c90;
  char local_1c79;
  QLatin1String local_1c78;
  char local_1c61;
  QLatin1String local_1c60;
  char local_1c49;
  QLatin1String local_1c48;
  char local_1c31;
  QLatin1String local_1c30;
  char local_1c19;
  QLatin1String local_1c18;
  char local_1c01;
  QLatin1String local_1c00;
  char local_1be9;
  QLatin1String local_1be8;
  char local_1bd1;
  QLatin1String local_1bd0;
  char local_1bb9;
  QLatin1String local_1bb8;
  char local_1ba1;
  QLatin1String local_1ba0;
  char local_1b89;
  QLatin1String local_1b88;
  char local_1b71;
  QLatin1String local_1b70;
  char local_1b59;
  QLatin1String local_1b58;
  char local_1b41;
  QLatin1String local_1b40;
  char local_1b29;
  QLatin1String local_1b28;
  char local_1b11;
  QLatin1String local_1b10;
  char local_1af9;
  QLatin1String local_1af8;
  char local_1ae1;
  QLatin1String local_1ae0;
  char local_1ac9;
  QLatin1String local_1ac8;
  char local_1ab1;
  QLatin1String local_1ab0;
  char local_1a99;
  QLatin1String local_1a98;
  char local_1a81;
  QLatin1String local_1a80;
  char local_1a69;
  QLatin1String local_1a68;
  char local_1a51;
  QLatin1String local_1a50;
  char local_1a39;
  QLatin1String local_1a38;
  char local_1a21;
  QLatin1String local_1a20;
  char local_1a09;
  QLatin1String local_1a08;
  char local_19f1;
  QLatin1String local_19f0;
  char local_19d9;
  QLatin1String local_19d8;
  char local_19c1;
  QLatin1String local_19c0;
  char local_19a9;
  QLatin1String local_19a8;
  char local_1991;
  QLatin1String local_1990;
  char local_1979;
  QLatin1String local_1978;
  char local_1961;
  QLatin1String local_1960;
  char local_1949;
  QLatin1String local_1948;
  char local_1931;
  QLatin1String local_1930;
  char local_1919;
  QLatin1String local_1918;
  char local_1901;
  QLatin1String local_1900;
  char local_18e9;
  QLatin1String local_18e8;
  char local_18d1;
  QLatin1String local_18d0;
  char local_18b9;
  QLatin1String local_18b8;
  char local_18a1;
  QLatin1String local_18a0;
  char local_1889;
  QLatin1String local_1888;
  char local_1871;
  QLatin1String local_1870;
  char local_1859;
  QLatin1String local_1858;
  char local_1841;
  QLatin1String local_1840;
  char local_1829;
  QLatin1String local_1828;
  char local_1811;
  QLatin1String local_1810;
  char local_17f9;
  QLatin1String local_17f8;
  char local_17e1;
  QLatin1String local_17e0;
  char local_17c9;
  QLatin1String local_17c8;
  char local_17b1;
  QLatin1String local_17b0;
  char local_1799;
  QLatin1String local_1798;
  char local_1781;
  QLatin1String local_1780;
  char local_1769;
  QLatin1String local_1768;
  char local_1751;
  QLatin1String local_1750;
  char local_1739;
  QLatin1String local_1738;
  char local_1721;
  QLatin1String local_1720;
  char local_1709;
  QLatin1String local_1708;
  char local_16f1;
  QLatin1String local_16f0;
  char local_16d9;
  QLatin1String local_16d8;
  char local_16c1;
  QLatin1String local_16c0;
  char local_16a9;
  QLatin1String local_16a8;
  char local_1691;
  QLatin1String local_1690;
  char local_1679;
  QLatin1String local_1678;
  char local_1661;
  QLatin1String local_1660;
  char local_1649;
  QLatin1String local_1648;
  char local_1631;
  QLatin1String local_1630;
  char local_1619;
  QLatin1String local_1618;
  char local_1601;
  QLatin1String local_1600;
  char local_15e9;
  QLatin1String local_15e8;
  char local_15d1;
  QLatin1String local_15d0;
  char local_15b9;
  QLatin1String local_15b8;
  char local_15a1;
  QLatin1String local_15a0;
  char local_1589;
  QLatin1String local_1588;
  char local_1571;
  QLatin1String local_1570;
  char local_1559;
  QLatin1String local_1558;
  char local_1541;
  QLatin1String local_1540;
  char local_1529;
  QLatin1String local_1528;
  char local_1511;
  QLatin1String local_1510;
  char local_14f9;
  QLatin1String local_14f8;
  char local_14e1;
  QLatin1String local_14e0;
  char local_14c9;
  QLatin1String local_14c8;
  char local_14b1;
  QLatin1String local_14b0;
  char local_1499;
  QLatin1String local_1498;
  char local_1481;
  QLatin1String local_1480;
  char local_1469;
  QLatin1String local_1468;
  char local_1451;
  QLatin1String local_1450;
  char local_1439;
  QLatin1String local_1438;
  char local_1421;
  QLatin1String local_1420;
  char local_1409;
  QLatin1String local_1408;
  char local_13f1;
  QLatin1String local_13f0;
  char local_13d9;
  QLatin1String local_13d8;
  char local_13c1;
  QLatin1String local_13c0;
  char local_13a9;
  QLatin1String local_13a8;
  char local_1391;
  QLatin1String local_1390;
  char local_1379;
  QLatin1String local_1378;
  char local_1361;
  QLatin1String local_1360;
  char local_1349;
  QLatin1String local_1348;
  char local_1331;
  QLatin1String local_1330;
  char local_1319;
  QLatin1String local_1318;
  char local_1301;
  QLatin1String local_1300;
  char local_12e9;
  QLatin1String local_12e8;
  char local_12d1;
  QLatin1String local_12d0;
  char local_12b9;
  QLatin1String local_12b8;
  char local_12a1;
  QLatin1String local_12a0;
  char local_1289;
  QLatin1String local_1288;
  char local_1271;
  QLatin1String local_1270;
  char local_1259;
  QLatin1String local_1258;
  char local_1241;
  QLatin1String local_1240;
  char local_1229;
  QLatin1String local_1228;
  char local_1211;
  QLatin1String local_1210;
  char local_11f9;
  QLatin1String local_11f8;
  char local_11e1;
  QLatin1String local_11e0;
  char local_11c9;
  QLatin1String local_11c8;
  char local_11b1;
  QLatin1String local_11b0;
  char local_1199;
  QLatin1String local_1198;
  char local_1181;
  QLatin1String local_1180;
  char local_1169;
  QLatin1String local_1168;
  char local_1151;
  QLatin1String local_1150;
  char local_1139;
  QLatin1String local_1138;
  char local_1121;
  QLatin1String local_1120;
  char local_1109;
  QLatin1String local_1108;
  char local_10f1;
  QLatin1String local_10f0;
  char local_10d9;
  QLatin1String local_10d8;
  char local_10c1;
  QLatin1String local_10c0;
  char local_10a9;
  QLatin1String local_10a8;
  char local_1091;
  QLatin1String local_1090;
  char local_1079;
  QLatin1String local_1078;
  char local_1061;
  QLatin1String local_1060;
  char local_1049;
  QLatin1String local_1048;
  char local_1031;
  QLatin1String local_1030;
  char local_1019;
  QLatin1String local_1018;
  char local_1001;
  QLatin1String local_1000;
  char local_fe9;
  QLatin1String local_fe8;
  char local_fd1;
  QLatin1String local_fd0;
  char local_fb9;
  QLatin1String local_fb8;
  char local_fa1;
  QLatin1String local_fa0;
  char local_f89;
  QLatin1String local_f88;
  char local_f71;
  QLatin1String local_f70;
  char local_f59;
  QLatin1String local_f58;
  char local_f41;
  QLatin1String local_f40;
  char local_f29;
  QLatin1String local_f28;
  char local_f11;
  QLatin1String local_f10;
  char local_ef9;
  QLatin1String local_ef8;
  char local_ee1;
  QLatin1String local_ee0;
  char local_ec9;
  pair<char,_QLatin1String> local_ec8;
  pair<char,_QLatin1String> pStack_eb0;
  pair<char,_QLatin1String> pStack_e98;
  pair<char,_QLatin1String> pStack_e80;
  pair<char,_QLatin1String> pStack_e68;
  pair<char,_QLatin1String> pStack_e50;
  pair<char,_QLatin1String> pStack_e38;
  pair<char,_QLatin1String> pStack_e20;
  pair<char,_QLatin1String> pStack_e08;
  pair<char,_QLatin1String> pStack_df0;
  pair<char,_QLatin1String> pStack_dd8;
  pair<char,_QLatin1String> pStack_dc0;
  pair<char,_QLatin1String> pStack_da8;
  pair<char,_QLatin1String> pStack_d90;
  pair<char,_QLatin1String> pStack_d78;
  pair<char,_QLatin1String> pStack_d60;
  pair<char,_QLatin1String> pStack_d48;
  pair<char,_QLatin1String> pStack_d30;
  pair<char,_QLatin1String> pStack_d18;
  pair<char,_QLatin1String> pStack_d00;
  pair<char,_QLatin1String> pStack_ce8;
  pair<char,_QLatin1String> pStack_cd0;
  pair<char,_QLatin1String> pStack_cb8;
  pair<char,_QLatin1String> pStack_ca0;
  pair<char,_QLatin1String> pStack_c88;
  pair<char,_QLatin1String> pStack_c70;
  pair<char,_QLatin1String> pStack_c58;
  pair<char,_QLatin1String> pStack_c40;
  pair<char,_QLatin1String> pStack_c28;
  pair<char,_QLatin1String> pStack_c10;
  pair<char,_QLatin1String> pStack_bf8;
  pair<char,_QLatin1String> pStack_be0;
  pair<char,_QLatin1String> pStack_bc8;
  pair<char,_QLatin1String> pStack_bb0;
  pair<char,_QLatin1String> pStack_b98;
  pair<char,_QLatin1String> pStack_b80;
  pair<char,_QLatin1String> pStack_b68;
  pair<char,_QLatin1String> pStack_b50;
  pair<char,_QLatin1String> pStack_b38;
  pair<char,_QLatin1String> pStack_b20;
  pair<char,_QLatin1String> pStack_b08;
  pair<char,_QLatin1String> pStack_af0;
  pair<char,_QLatin1String> pStack_ad8;
  pair<char,_QLatin1String> pStack_ac0;
  pair<char,_QLatin1String> pStack_aa8;
  pair<char,_QLatin1String> pStack_a90;
  pair<char,_QLatin1String> pStack_a78;
  pair<char,_QLatin1String> pStack_a60;
  pair<char,_QLatin1String> pStack_a48;
  pair<char,_QLatin1String> pStack_a30;
  pair<char,_QLatin1String> pStack_a18;
  pair<char,_QLatin1String> pStack_a00;
  pair<char,_QLatin1String> pStack_9e8;
  pair<char,_QLatin1String> pStack_9d0;
  pair<char,_QLatin1String> pStack_9b8;
  pair<char,_QLatin1String> pStack_9a0;
  pair<char,_QLatin1String> pStack_988;
  pair<char,_QLatin1String> pStack_970;
  pair<char,_QLatin1String> pStack_958;
  pair<char,_QLatin1String> pStack_940;
  pair<char,_QLatin1String> pStack_928;
  pair<char,_QLatin1String> pStack_910;
  pair<char,_QLatin1String> pStack_8f8;
  pair<char,_QLatin1String> pStack_8e0;
  pair<char,_QLatin1String> pStack_8c8;
  pair<char,_QLatin1String> pStack_8b0;
  pair<char,_QLatin1String> pStack_898;
  pair<char,_QLatin1String> pStack_880;
  pair<char,_QLatin1String> pStack_868;
  pair<char,_QLatin1String> pStack_850;
  pair<char,_QLatin1String> pStack_838;
  pair<char,_QLatin1String> pStack_820;
  pair<char,_QLatin1String> pStack_808;
  pair<char,_QLatin1String> pStack_7f0;
  pair<char,_QLatin1String> pStack_7d8;
  pair<char,_QLatin1String> pStack_7c0;
  pair<char,_QLatin1String> pStack_7a8;
  pair<char,_QLatin1String> pStack_790;
  pair<char,_QLatin1String> pStack_778;
  pair<char,_QLatin1String> pStack_760;
  pair<char,_QLatin1String> pStack_748;
  pair<char,_QLatin1String> pStack_730;
  pair<char,_QLatin1String> pStack_718;
  pair<char,_QLatin1String> pStack_700;
  pair<char,_QLatin1String> pStack_6e8;
  pair<char,_QLatin1String> pStack_6d0;
  pair<char,_QLatin1String> pStack_6b8;
  pair<char,_QLatin1String> pStack_6a0;
  pair<char,_QLatin1String> pStack_688;
  pair<char,_QLatin1String> pStack_670;
  pair<char,_QLatin1String> pStack_658;
  pair<char,_QLatin1String> pStack_640;
  pair<char,_QLatin1String> pStack_628;
  pair<char,_QLatin1String> pStack_610;
  pair<char,_QLatin1String> pStack_5f8;
  pair<char,_QLatin1String> pStack_5e0;
  pair<char,_QLatin1String> pStack_5c8;
  pair<char,_QLatin1String> pStack_5b0;
  pair<char,_QLatin1String> pStack_598;
  pair<char,_QLatin1String> pStack_580;
  pair<char,_QLatin1String> pStack_568;
  pair<char,_QLatin1String> pStack_550;
  pair<char,_QLatin1String> pStack_538;
  pair<char,_QLatin1String> pStack_520;
  pair<char,_QLatin1String> pStack_508;
  pair<char,_QLatin1String> pStack_4f0;
  pair<char,_QLatin1String> pStack_4d8;
  pair<char,_QLatin1String> pStack_4c0;
  pair<char,_QLatin1String> pStack_4a8;
  pair<char,_QLatin1String> pStack_490;
  pair<char,_QLatin1String> pStack_478;
  pair<char,_QLatin1String> pStack_460;
  pair<char,_QLatin1String> pStack_448;
  pair<char,_QLatin1String> pStack_430;
  pair<char,_QLatin1String> pStack_418;
  pair<char,_QLatin1String> pStack_400;
  pair<char,_QLatin1String> pStack_3e8;
  pair<char,_QLatin1String> pStack_3d0;
  pair<char,_QLatin1String> pStack_3b8;
  pair<char,_QLatin1String> pStack_3a0;
  pair<char,_QLatin1String> pStack_388;
  pair<char,_QLatin1String> pStack_370;
  pair<char,_QLatin1String> pStack_358;
  pair<char,_QLatin1String> pStack_340;
  pair<char,_QLatin1String> pStack_328;
  pair<char,_QLatin1String> pStack_310;
  pair<char,_QLatin1String> pStack_2f8;
  pair<char,_QLatin1String> pStack_2e0;
  pair<char,_QLatin1String> pStack_2c8;
  pair<char,_QLatin1String> pStack_2b0;
  pair<char,_QLatin1String> pStack_298;
  pair<char,_QLatin1String> pStack_280;
  pair<char,_QLatin1String> pStack_268;
  pair<char,_QLatin1String> pStack_250;
  pair<char,_QLatin1String> pStack_238;
  pair<char,_QLatin1String> pStack_220;
  pair<char,_QLatin1String> pStack_208;
  pair<char,_QLatin1String> pStack_1f0;
  pair<char,_QLatin1String> pStack_1d8;
  pair<char,_QLatin1String> pStack_1c0;
  pair<char,_QLatin1String> pStack_1a8;
  pair<char,_QLatin1String> pStack_190;
  pair<char,_QLatin1String> pStack_178;
  pair<char,_QLatin1String> pStack_160;
  pair<char,_QLatin1String> pStack_148;
  pair<char,_QLatin1String> pStack_130;
  pair<char,_QLatin1String> pStack_118;
  pair<char,_QLatin1String> pStack_100;
  pair<char,_QLatin1String> pStack_e8;
  pair<char,_QLatin1String> pStack_d0;
  pair<char,_QLatin1String> pStack_b8;
  pair<char,_QLatin1String> pStack_a0;
  pair<char,_QLatin1String> pStack_88;
  pair<char,_QLatin1String> pStack_70;
  pair<char,_QLatin1String> pStack_58;
  pair<char,_QLatin1String> pStack_40;
  iterator local_28;
  undefined8 local_20;
  QMultiHash<char,_QLatin1String> local_18;
  
  local_ec9 = 'b';
  QLatin1String::QLatin1String(&local_ee0,"break");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_ec8,&local_ec9,&local_ee0);
  local_ee1 = 'c';
  QLatin1String::QLatin1String(&local_ef8,"cmake_host_system_information");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_eb0,&local_ee1,&local_ef8)
  ;
  local_ef9 = 'c';
  QLatin1String::QLatin1String(&local_f10,"cmake_minimum_required");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e98,&local_ef9,&local_f10)
  ;
  local_f11 = 'c';
  QLatin1String::QLatin1String(&local_f28,"cmake_parse_arguments");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e80,&local_f11,&local_f28)
  ;
  local_f29 = 'c';
  QLatin1String::QLatin1String(&local_f40,"cmake_policy");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e68,&local_f29,&local_f40)
  ;
  local_f41 = 'c';
  QLatin1String::QLatin1String(&local_f58,"configure_file");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e50,&local_f41,&local_f58)
  ;
  local_f59 = 'c';
  QLatin1String::QLatin1String(&local_f70,"continue");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e38,&local_f59,&local_f70)
  ;
  local_f71 = 'e';
  QLatin1String::QLatin1String(&local_f88,"elseif");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e20,&local_f71,&local_f88)
  ;
  local_f89 = 'e';
  QLatin1String::QLatin1String(&local_fa0,"else");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e08,&local_f89,&local_fa0)
  ;
  local_fa1 = 'e';
  QLatin1String::QLatin1String(&local_fb8,"endforeach");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_df0,&local_fa1,&local_fb8)
  ;
  local_fb9 = 'e';
  QLatin1String::QLatin1String(&local_fd0,"endfunction");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_dd8,&local_fb9,&local_fd0)
  ;
  local_fd1 = 'e';
  QLatin1String::QLatin1String(&local_fe8,"endif");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_dc0,&local_fd1,&local_fe8)
  ;
  local_fe9 = 'e';
  QLatin1String::QLatin1String(&local_1000,"endmacro");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_da8,&local_fe9,&local_1000);
  local_1001 = 'e';
  QLatin1String::QLatin1String(&local_1018,"endwhile");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d90,&local_1001,&local_1018);
  local_1019 = 'e';
  QLatin1String::QLatin1String(&local_1030,"execute_process");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d78,&local_1019,&local_1030);
  local_1031 = 'f';
  QLatin1String::QLatin1String(&local_1048,"file");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d60,&local_1031,&local_1048);
  local_1049 = 'f';
  QLatin1String::QLatin1String(&local_1060,"find_file");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d48,&local_1049,&local_1060);
  local_1061 = 'f';
  QLatin1String::QLatin1String(&local_1078,"find_library");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d30,&local_1061,&local_1078);
  local_1079 = 'f';
  QLatin1String::QLatin1String(&local_1090,"find_package");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d18,&local_1079,&local_1090);
  local_1091 = 'f';
  QLatin1String::QLatin1String(&local_10a8,"find_path");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d00,&local_1091,&local_10a8);
  local_10a9 = 'f';
  QLatin1String::QLatin1String(&local_10c0,"find_program");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ce8,&local_10a9,&local_10c0);
  local_10c1 = 'f';
  QLatin1String::QLatin1String(&local_10d8,"foreach");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_cd0,&local_10c1,&local_10d8);
  local_10d9 = 'f';
  QLatin1String::QLatin1String(&local_10f0,"function");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_cb8,&local_10d9,&local_10f0);
  local_10f1 = 'g';
  QLatin1String::QLatin1String(&local_1108,"get_cmake_property");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ca0,&local_10f1,&local_1108);
  local_1109 = 'g';
  QLatin1String::QLatin1String(&local_1120,"get_directory_property");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c88,&local_1109,&local_1120);
  local_1121 = 'g';
  QLatin1String::QLatin1String(&local_1138,"get_filename_component");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c70,&local_1121,&local_1138);
  local_1139 = 'g';
  QLatin1String::QLatin1String(&local_1150,"get_property");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c58,&local_1139,&local_1150);
  local_1151 = 'i';
  QLatin1String::QLatin1String(&local_1168,"if");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c40,&local_1151,&local_1168);
  local_1169 = 'i';
  QLatin1String::QLatin1String(&local_1180,"include");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c28,&local_1169,&local_1180);
  local_1181 = 'i';
  QLatin1String::QLatin1String(&local_1198,"include_guard");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c10,&local_1181,&local_1198);
  local_1199 = 'l';
  QLatin1String::QLatin1String(&local_11b0,"list");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_bf8,&local_1199,&local_11b0);
  local_11b1 = 'm';
  QLatin1String::QLatin1String(&local_11c8,"macro");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_be0,&local_11b1,&local_11c8);
  local_11c9 = 'm';
  QLatin1String::QLatin1String(&local_11e0,"mark_as_advanced");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_bc8,&local_11c9,&local_11e0);
  local_11e1 = 'm';
  QLatin1String::QLatin1String(&local_11f8,"math");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_bb0,&local_11e1,&local_11f8);
  local_11f9 = 'm';
  QLatin1String::QLatin1String(&local_1210,"message");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b98,&local_11f9,&local_1210);
  local_1211 = 'o';
  QLatin1String::QLatin1String(&local_1228,"option");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b80,&local_1211,&local_1228);
  local_1229 = 'r';
  QLatin1String::QLatin1String(&local_1240,"return");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b68,&local_1229,&local_1240);
  local_1241 = 's';
  QLatin1String::QLatin1String(&local_1258,"separate_arguments");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b50,&local_1241,&local_1258);
  local_1259 = 's';
  QLatin1String::QLatin1String(&local_1270,"set_directory_properties");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b38,&local_1259,&local_1270);
  local_1271 = 's';
  QLatin1String::QLatin1String(&local_1288,"set");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b20,&local_1271,&local_1288);
  local_1289 = 's';
  QLatin1String::QLatin1String(&local_12a0,"set_property");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b08,&local_1289,&local_12a0);
  local_12a1 = 's';
  QLatin1String::QLatin1String(&local_12b8,"site_name");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_af0,&local_12a1,&local_12b8);
  local_12b9 = 's';
  QLatin1String::QLatin1String(&local_12d0,"string");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ad8,&local_12b9,&local_12d0);
  local_12d1 = 'u';
  QLatin1String::QLatin1String(&local_12e8,"unset");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ac0,&local_12d1,&local_12e8);
  local_12e9 = 'v';
  QLatin1String::QLatin1String(&local_1300,"variable_watch");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_aa8,&local_12e9,&local_1300);
  local_1301 = 'w';
  QLatin1String::QLatin1String(&local_1318,"while");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a90,&local_1301,&local_1318);
  local_1319 = 'a';
  QLatin1String::QLatin1String(&local_1330,"add_compile_definitions");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a78,&local_1319,&local_1330);
  local_1331 = 'a';
  QLatin1String::QLatin1String(&local_1348,"add_compile_options");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a60,&local_1331,&local_1348);
  local_1349 = 'A';
  QLatin1String::QLatin1String(&local_1360,"ADD_COMPILE_OPTIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a48,&local_1349,&local_1360);
  local_1361 = 'a';
  QLatin1String::QLatin1String(&local_1378,"add_custom_command");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a30,&local_1361,&local_1378);
  local_1379 = 'a';
  QLatin1String::QLatin1String(&local_1390,"add_custom_target");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a18,&local_1379,&local_1390);
  local_1391 = 'a';
  QLatin1String::QLatin1String(&local_13a8,"add_definitions");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a00,&local_1391,&local_13a8);
  local_13a9 = 'a';
  QLatin1String::QLatin1String(&local_13c0,"add_dependencies");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9e8,&local_13a9,&local_13c0);
  local_13c1 = 'a';
  QLatin1String::QLatin1String(&local_13d8,"add_executable");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9d0,&local_13c1,&local_13d8);
  local_13d9 = 'a';
  QLatin1String::QLatin1String(&local_13f0,"add_library");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9b8,&local_13d9,&local_13f0);
  local_13f1 = 'a';
  QLatin1String::QLatin1String(&local_1408,"add_link_options");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9a0,&local_13f1,&local_1408);
  local_1409 = 'a';
  QLatin1String::QLatin1String(&local_1420,"add_subdirectory");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_988,&local_1409,&local_1420);
  local_1421 = 'a';
  QLatin1String::QLatin1String(&local_1438,"add_test");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_970,&local_1421,&local_1438);
  local_1439 = 'a';
  QLatin1String::QLatin1String(&local_1450,"aux_source_directory");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_958,&local_1439,&local_1450);
  local_1451 = 'b';
  QLatin1String::QLatin1String(&local_1468,"build_command");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_940,&local_1451,&local_1468);
  local_1469 = 'c';
  QLatin1String::QLatin1String(&local_1480,"create_test_sourcelist");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_928,&local_1469,&local_1480);
  local_1481 = 'd';
  QLatin1String::QLatin1String(&local_1498,"define_property");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_910,&local_1481,&local_1498);
  local_1499 = 'e';
  QLatin1String::QLatin1String(&local_14b0,"enable_language");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8f8,&local_1499,&local_14b0);
  local_14b1 = 'e';
  QLatin1String::QLatin1String(&local_14c8,"enable_testing");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8e0,&local_14b1,&local_14c8);
  local_14c9 = 'e';
  QLatin1String::QLatin1String(&local_14e0,"export");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8c8,&local_14c9,&local_14e0);
  local_14e1 = 'f';
  QLatin1String::QLatin1String(&local_14f8,"fltk_wrap_ui");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8b0,&local_14e1,&local_14f8);
  local_14f9 = 'g';
  QLatin1String::QLatin1String(&local_1510,"get_source_file_property");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_898,&local_14f9,&local_1510);
  local_1511 = 'g';
  QLatin1String::QLatin1String(&local_1528,"get_target_property");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_880,&local_1511,&local_1528);
  local_1529 = 'g';
  QLatin1String::QLatin1String(&local_1540,"get_test_property");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_868,&local_1529,&local_1540);
  local_1541 = 'i';
  QLatin1String::QLatin1String(&local_1558,"include_directories");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_850,&local_1541,&local_1558);
  local_1559 = 'i';
  QLatin1String::QLatin1String(&local_1570,"include_external_msproject");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_838,&local_1559,&local_1570);
  local_1571 = 'i';
  QLatin1String::QLatin1String(&local_1588,"include_regular_expression");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_820,&local_1571,&local_1588);
  local_1589 = 'i';
  QLatin1String::QLatin1String(&local_15a0,"install");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_808,&local_1589,&local_15a0);
  local_15a1 = 'l';
  QLatin1String::QLatin1String(&local_15b8,"link_directories");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7f0,&local_15a1,&local_15b8);
  local_15b9 = 'l';
  QLatin1String::QLatin1String(&local_15d0,"link_libraries");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7d8,&local_15b9,&local_15d0);
  local_15d1 = 'l';
  QLatin1String::QLatin1String(&local_15e8,"load_cache");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7c0,&local_15d1,&local_15e8);
  local_15e9 = 'p';
  QLatin1String::QLatin1String(&local_1600,"project");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7a8,&local_15e9,&local_1600);
  local_1601 = 'q';
  QLatin1String::QLatin1String(&local_1618,"qt_wrap_cpp");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_790,&local_1601,&local_1618);
  local_1619 = 'q';
  QLatin1String::QLatin1String(&local_1630,"qt_wrap_ui");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_778,&local_1619,&local_1630);
  local_1631 = 'r';
  QLatin1String::QLatin1String(&local_1648,"remove_definitions");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_760,&local_1631,&local_1648);
  local_1649 = 's';
  QLatin1String::QLatin1String(&local_1660,"set_source_files_properties");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_748,&local_1649,&local_1660);
  local_1661 = 's';
  QLatin1String::QLatin1String(&local_1678,"set_target_properties");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_730,&local_1661,&local_1678);
  local_1679 = 's';
  QLatin1String::QLatin1String(&local_1690,"set_tests_properties");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_718,&local_1679,&local_1690);
  local_1691 = 's';
  QLatin1String::QLatin1String(&local_16a8,"source_group");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_700,&local_1691,&local_16a8);
  local_16a9 = 't';
  QLatin1String::QLatin1String(&local_16c0,"target_compile_definitions");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_6e8,&local_16a9,&local_16c0);
  local_16c1 = 't';
  QLatin1String::QLatin1String(&local_16d8,"target_compile_features");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_6d0,&local_16c1,&local_16d8);
  local_16d9 = 't';
  QLatin1String::QLatin1String(&local_16f0,"target_compile_options");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_6b8,&local_16d9,&local_16f0);
  local_16f1 = 't';
  QLatin1String::QLatin1String(&local_1708,"target_include_directories");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_6a0,&local_16f1,&local_1708);
  local_1709 = 't';
  QLatin1String::QLatin1String(&local_1720,"target_link_directories");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_688,&local_1709,&local_1720);
  local_1721 = 't';
  QLatin1String::QLatin1String(&local_1738,"target_link_libraries");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_670,&local_1721,&local_1738);
  local_1739 = 't';
  QLatin1String::QLatin1String(&local_1750,"target_link_options");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_658,&local_1739,&local_1750);
  local_1751 = 't';
  QLatin1String::QLatin1String(&local_1768,"target_sources");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_640,&local_1751,&local_1768);
  local_1769 = 't';
  QLatin1String::QLatin1String(&local_1780,"try_compile");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_628,&local_1769,&local_1780);
  local_1781 = 't';
  QLatin1String::QLatin1String(&local_1798,"try_run");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_610,&local_1781,&local_1798);
  local_1799 = 'c';
  QLatin1String::QLatin1String(&local_17b0,"ctest_build");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5f8,&local_1799,&local_17b0);
  local_17b1 = 'c';
  QLatin1String::QLatin1String(&local_17c8,"ctest_configure");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5e0,&local_17b1,&local_17c8);
  local_17c9 = 'c';
  QLatin1String::QLatin1String(&local_17e0,"ctest_coverage");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5c8,&local_17c9,&local_17e0);
  local_17e1 = 'c';
  QLatin1String::QLatin1String(&local_17f8,"ctest_empty_binary_directory");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5b0,&local_17e1,&local_17f8);
  local_17f9 = 'c';
  QLatin1String::QLatin1String(&local_1810,"ctest_memcheck");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_598,&local_17f9,&local_1810);
  local_1811 = 'c';
  QLatin1String::QLatin1String(&local_1828,"ctest_read_custom_files");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_580,&local_1811,&local_1828);
  local_1829 = 'c';
  QLatin1String::QLatin1String(&local_1840,"ctest_run_script");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_568,&local_1829,&local_1840);
  local_1841 = 'c';
  QLatin1String::QLatin1String(&local_1858,"ctest_sleep");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_550,&local_1841,&local_1858);
  local_1859 = 'c';
  QLatin1String::QLatin1String(&local_1870,"ctest_start");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_538,&local_1859,&local_1870);
  local_1871 = 'c';
  QLatin1String::QLatin1String(&local_1888,"ctest_submit");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_520,&local_1871,&local_1888);
  local_1889 = 'c';
  QLatin1String::QLatin1String(&local_18a0,"ctest_test");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_508,&local_1889,&local_18a0);
  local_18a1 = 'c';
  QLatin1String::QLatin1String(&local_18b8,"ctest_update");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4f0,&local_18a1,&local_18b8);
  local_18b9 = 'c';
  QLatin1String::QLatin1String(&local_18d0,"ctest_upload");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4d8,&local_18b9,&local_18d0);
  local_18d1 = 'b';
  QLatin1String::QLatin1String(&local_18e8,"build_name");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4c0,&local_18d1,&local_18e8);
  local_18e9 = 'e';
  QLatin1String::QLatin1String(&local_1900,"exec_program");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4a8,&local_18e9,&local_1900);
  local_1901 = 'e';
  QLatin1String::QLatin1String(&local_1918,"export_library_dependencies");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_490,&local_1901,&local_1918);
  local_1919 = 'i';
  QLatin1String::QLatin1String(&local_1930,"install_files");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_478,&local_1919,&local_1930);
  local_1931 = 'i';
  QLatin1String::QLatin1String(&local_1948,"install_programs");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_460,&local_1931,&local_1948);
  local_1949 = 'i';
  QLatin1String::QLatin1String(&local_1960,"install_targets");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_448,&local_1949,&local_1960);
  local_1961 = 'l';
  QLatin1String::QLatin1String(&local_1978,"load_command");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_430,&local_1961,&local_1978);
  local_1979 = 'm';
  QLatin1String::QLatin1String(&local_1990,"make_directory");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_418,&local_1979,&local_1990);
  local_1991 = 'o';
  QLatin1String::QLatin1String(&local_19a8,"output_required_files");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_400,&local_1991,&local_19a8);
  local_19a9 = 'r';
  QLatin1String::QLatin1String(&local_19c0,"remove");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3e8,&local_19a9,&local_19c0);
  local_19c1 = 's';
  QLatin1String::QLatin1String(&local_19d8,"subdir_depends");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3d0,&local_19c1,&local_19d8);
  local_19d9 = 's';
  QLatin1String::QLatin1String(&local_19f0,"subdirs");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3b8,&local_19d9,&local_19f0);
  local_19f1 = 'u';
  QLatin1String::QLatin1String(&local_1a08,"use_mangled_mesa");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3a0,&local_19f1,&local_1a08);
  local_1a09 = 'u';
  QLatin1String::QLatin1String(&local_1a20,"utility_source");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_388,&local_1a09,&local_1a20);
  local_1a21 = 'v';
  QLatin1String::QLatin1String(&local_1a38,"variable_requires");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_370,&local_1a21,&local_1a38);
  local_1a39 = 'w';
  QLatin1String::QLatin1String(&local_1a50,"write_file");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_358,&local_1a39,&local_1a50);
  local_1a51 = 'q';
  QLatin1String::QLatin1String(&local_1a68,"qt5_use_modules");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_340,&local_1a51,&local_1a68);
  local_1a69 = 'q';
  QLatin1String::QLatin1String(&local_1a80,"qt5_use_package");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_328,&local_1a69,&local_1a80);
  local_1a81 = 'q';
  QLatin1String::QLatin1String(&local_1a98,"qt5_wrap_cpp");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_310,&local_1a81,&local_1a98);
  local_1a99 = 'a';
  QLatin1String::QLatin1String(&local_1ab0,"and");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2f8,&local_1a99,&local_1ab0);
  local_1ab1 = 'o';
  QLatin1String::QLatin1String(&local_1ac8,"or");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2e0,&local_1ab1,&local_1ac8);
  local_1ac9 = 'n';
  QLatin1String::QLatin1String(&local_1ae0,"not");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2c8,&local_1ac9,&local_1ae0);
  local_1ae1 = 'c';
  QLatin1String::QLatin1String(&local_1af8,"command");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2b0,&local_1ae1,&local_1af8);
  local_1af9 = 'p';
  QLatin1String::QLatin1String(&local_1b10,"policy");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_298,&local_1af9,&local_1b10);
  local_1b11 = 't';
  QLatin1String::QLatin1String(&local_1b28,"target");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_280,&local_1b11,&local_1b28);
  local_1b29 = 't';
  QLatin1String::QLatin1String(&local_1b40,"test");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_268,&local_1b29,&local_1b40);
  local_1b41 = 'e';
  QLatin1String::QLatin1String(&local_1b58,"exists");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_250,&local_1b41,&local_1b58);
  local_1b59 = 'i';
  QLatin1String::QLatin1String(&local_1b70,"is_newer_than");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_238,&local_1b59,&local_1b70);
  local_1b71 = 'i';
  QLatin1String::QLatin1String(&local_1b88,"is_directory");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_220,&local_1b71,&local_1b88);
  local_1b89 = 'i';
  QLatin1String::QLatin1String(&local_1ba0,"is_symlink");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_208,&local_1b89,&local_1ba0);
  local_1ba1 = 'i';
  QLatin1String::QLatin1String(&local_1bb8,"is_absolute");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1f0,&local_1ba1,&local_1bb8);
  local_1bb9 = 'm';
  QLatin1String::QLatin1String(&local_1bd0,"matches");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1d8,&local_1bb9,&local_1bd0);
  local_1bd1 = 'l';
  QLatin1String::QLatin1String(&local_1be8,"less");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1c0,&local_1bd1,&local_1be8);
  local_1be9 = 'g';
  QLatin1String::QLatin1String(&local_1c00,"greater");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1a8,&local_1be9,&local_1c00);
  local_1c01 = 'e';
  QLatin1String::QLatin1String(&local_1c18,"equal");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_190,&local_1c01,&local_1c18);
  local_1c19 = 'l';
  QLatin1String::QLatin1String(&local_1c30,"less_equal");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_178,&local_1c19,&local_1c30);
  local_1c31 = 'g';
  QLatin1String::QLatin1String(&local_1c48,"greater_equal");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_160,&local_1c31,&local_1c48);
  local_1c49 = 's';
  QLatin1String::QLatin1String(&local_1c60,"strless");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_148,&local_1c49,&local_1c60);
  local_1c61 = 's';
  QLatin1String::QLatin1String(&local_1c78,"strgreater");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_130,&local_1c61,&local_1c78);
  local_1c79 = 's';
  QLatin1String::QLatin1String(&local_1c90,"strequal");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_118,&local_1c79,&local_1c90);
  local_1c91 = 's';
  QLatin1String::QLatin1String(&local_1ca8,"strless_equal");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_100,&local_1c91,&local_1ca8);
  local_1ca9 = 's';
  QLatin1String::QLatin1String(&local_1cc0,"strgreater_equal");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e8,&local_1ca9,&local_1cc0);
  local_1cc1 = 'v';
  QLatin1String::QLatin1String(&local_1cd8,"version_less");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d0,&local_1cc1,&local_1cd8);
  local_1cd9 = 'v';
  QLatin1String::QLatin1String(&local_1cf0,"version_greater");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b8,&local_1cd9,&local_1cf0);
  local_1cf1 = 'v';
  QLatin1String::QLatin1String(&local_1d08,"version_equal");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a0,&local_1cf1,&local_1d08);
  local_1d09 = 'v';
  QLatin1String::QLatin1String(&local_1d20,"version_less_equal");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_88,&local_1d09,&local_1d20);
  local_1d21 = 'v';
  QLatin1String::QLatin1String(&local_1d38,"version_greater_equal");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_70,&local_1d21,&local_1d38);
  local_1d39 = 'i';
  QLatin1String::QLatin1String(&local_1d50,"in_list");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_58,&local_1d39,&local_1d50);
  local_1d51 = 'd';
  QLatin1String::QLatin1String(&local_1d68,"defined");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_40,&local_1d51,&local_1d68);
  local_28 = &local_ec8;
  local_20 = 0x9c;
  list_02._M_len = 0x9c;
  list_02._M_array = local_28;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_18,list_02);
  QMultiHash<char,_QLatin1String>::operator=(&cmake_keywords,&local_18);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_18);
  memset(&local_1d78,0,0x10);
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_1d78);
  QMultiHash<char,_QLatin1String>::operator=(&cmake_types,&local_1d78);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_1d78);
  local_1e59 = 'o';
  QLatin1String::QLatin1String(&local_1e70,"on");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&local_1e58,&local_1e59,&local_1e70);
  local_1e71 = 'o';
  QLatin1String::QLatin1String(&local_1e88,"off");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1e40,&local_1e71,&local_1e88);
  local_1e89 = 'O';
  QLatin1String::QLatin1String(&local_1ea0,"ON");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1e28,&local_1e89,&local_1ea0);
  local_1ea1 = 'O';
  QLatin1String::QLatin1String(&local_1eb8,"OFF");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1e10,&local_1ea1,&local_1eb8);
  local_1eb9 = 't';
  QLatin1String::QLatin1String(&local_1ed0,"true");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1df8,&local_1eb9,&local_1ed0);
  local_1ed1 = 'f';
  QLatin1String::QLatin1String(&local_1ee8,"false");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1de0,&local_1ed1,&local_1ee8);
  local_1ee9 = 'T';
  QLatin1String::QLatin1String(&local_1f00,"TRUE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1dc8,&local_1ee9,&local_1f00);
  local_1f01 = 'F';
  QLatin1String::QLatin1String(&local_1f18,"FALSE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1db0,&local_1f01,&local_1f18);
  local_1d98 = &local_1e58;
  local_1d90 = 8;
  list_01._M_len = 8;
  list_01._M_array = local_1d98;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_1d88,list_01);
  QMultiHash<char,_QLatin1String>::operator=(&cmake_literals,&local_1d88);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_1d88);
  local_3289 = 'A';
  QLatin1String::QLatin1String(&local_32a0,"ALLOW_DUPLICATE_CUSTOM_TARGETS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&local_3288,&local_3289,&local_32a0);
  local_32a1 = 'A';
  QLatin1String::QLatin1String(&local_32b8,"AUTOGEN_TARGETS_FOLDER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3270,&local_32a1,&local_32b8);
  local_32b9 = 'A';
  QLatin1String::QLatin1String(&local_32d0,"AUTOMOC_TARGETS_FOLDER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3258,&local_32b9,&local_32d0);
  local_32d1 = 'D';
  QLatin1String::QLatin1String(&local_32e8,"DEBUG_CONFIGURATIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3240,&local_32d1,&local_32e8);
  local_32e9 = 'D';
  QLatin1String::QLatin1String(&local_3300,"DISABLED_FEATURES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3228,&local_32e9,&local_3300);
  local_3301 = 'E';
  QLatin1String::QLatin1String(&local_3318,"ENABLED_FEATURES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3210,&local_3301,&local_3318);
  local_3319 = 'E';
  QLatin1String::QLatin1String(&local_3330,"ENABLED_LANGUAGES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_31f8,&local_3319,&local_3330);
  local_3331 = 'F';
  QLatin1String::QLatin1String(&local_3348,"FIND_LIBRARY_USE_LIB64_PATHS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_31e0,&local_3331,&local_3348);
  local_3349 = 'F';
  QLatin1String::QLatin1String(&local_3360,"FIND_LIBRARY_USE_OPENBSD_VERSIONING");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_31c8,&local_3349,&local_3360);
  local_3361 = 'G';
  QLatin1String::QLatin1String(&local_3378,"GLOBAL_DEPENDS_DEBUG_MODE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_31b0,&local_3361,&local_3378);
  local_3379 = 'G';
  QLatin1String::QLatin1String(&local_3390,"GLOBAL_DEPENDS_NO_CYCLES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3198,&local_3379,&local_3390);
  local_3391 = 'I';
  QLatin1String::QLatin1String(&local_33a8,"IN_TRY_COMPILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3180,&local_3391,&local_33a8);
  local_33a9 = 'P';
  QLatin1String::QLatin1String(&local_33c0,"PACKAGES_FOUND");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3168,&local_33a9,&local_33c0);
  local_33c1 = 'P';
  QLatin1String::QLatin1String(&local_33d8,"PACKAGES_NOT_FOUND");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3150,&local_33c1,&local_33d8);
  local_33d9 = 'J';
  QLatin1String::QLatin1String(&local_33f0,"JOB_POOLS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3138,&local_33d9,&local_33f0);
  local_33f1 = 'P';
  QLatin1String::QLatin1String(&local_3408,"PREDEFINED_TARGETS_FOLDER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3120,&local_33f1,&local_3408);
  local_3409 = 'E';
  QLatin1String::QLatin1String(&local_3420,"ECLIPSE_EXTRA_NATURES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3108,&local_3409,&local_3420);
  local_3421 = 'R';
  QLatin1String::QLatin1String(&local_3438,"REPORT_UNDEFINED_PROPERTIES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_30f0,&local_3421,&local_3438);
  local_3439 = 'R';
  QLatin1String::QLatin1String(&local_3450,"RULE_LAUNCH_COMPILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_30d8,&local_3439,&local_3450);
  local_3451 = 'R';
  QLatin1String::QLatin1String(&local_3468,"RULE_LAUNCH_CUSTOM");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_30c0,&local_3451,&local_3468);
  local_3469 = 'R';
  QLatin1String::QLatin1String(&local_3480,"RULE_LAUNCH_LINK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_30a8,&local_3469,&local_3480);
  local_3481 = 'R';
  QLatin1String::QLatin1String(&local_3498,"RULE_MESSAGES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3090,&local_3481,&local_3498);
  local_3499 = 'T';
  QLatin1String::QLatin1String(&local_34b0,"TARGET_ARCHIVES_MAY_BE_SHARED_LIBS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3078,&local_3499,&local_34b0);
  local_34b1 = 'T';
  QLatin1String::QLatin1String(&local_34c8,"TARGET_SUPPORTS_SHARED_LIBS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3060,&local_34b1,&local_34c8);
  local_34c9 = 'U';
  QLatin1String::QLatin1String(&local_34e0,"USE_FOLDERS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3048,&local_34c9,&local_34e0);
  local_34e1 = 'A';
  QLatin1String::QLatin1String(&local_34f8,"ADDITIONAL_MAKE_CLEAN_FILES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3030,&local_34e1,&local_34f8);
  local_34f9 = 'C';
  QLatin1String::QLatin1String(&local_3510,"CACHE_VARIABLES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3018,&local_34f9,&local_3510);
  local_3511 = 'C';
  QLatin1String::QLatin1String(&local_3528,"CLEAN_NO_CUSTOM");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3000,&local_3511,&local_3528);
  local_3529 = 'C';
  QLatin1String::QLatin1String(&local_3540,"CMAKE_CONFIGURE_DEPENDS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2fe8,&local_3529,&local_3540);
  local_3541 = 'C';
  QLatin1String::QLatin1String(&local_3558,"COMPILE_DEFINITIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2fd0,&local_3541,&local_3558);
  local_3559 = 'C';
  QLatin1String::QLatin1String(&local_3570,"COMPILE_OPTIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2fb8,&local_3559,&local_3570);
  local_3571 = 'D';
  QLatin1String::QLatin1String(&local_3588,"DEFINITIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2fa0,&local_3571,&local_3588);
  local_3589 = 'E';
  QLatin1String::QLatin1String(&local_35a0,"EXCLUDE_FROM_ALL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2f88,&local_3589,&local_35a0);
  local_35a1 = 'I';
  QLatin1String::QLatin1String(&local_35b8,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2f70,&local_35a1,&local_35b8);
  local_35b9 = 'I';
  QLatin1String::QLatin1String(&local_35d0,"INCLUDE_DIRECTORIES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2f58,&local_35b9,&local_35d0);
  local_35d1 = 'I';
  QLatin1String::QLatin1String(&local_35e8,"INCLUDE_REGULAR_EXPRESSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2f40,&local_35d1,&local_35e8);
  local_35e9 = 'I';
  QLatin1String::QLatin1String(&local_3600,"INTERPROCEDURAL_OPTIMIZATION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2f28,&local_35e9,&local_3600);
  local_3601 = 'L';
  QLatin1String::QLatin1String(&local_3618,"LINK_DIRECTORIES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2f10,&local_3601,&local_3618);
  local_3619 = 'L';
  QLatin1String::QLatin1String(&local_3630,"LISTFILE_STACK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2ef8,&local_3619,&local_3630);
  local_3631 = 'M';
  QLatin1String::QLatin1String(&local_3648,"MACROS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2ee0,&local_3631,&local_3648);
  local_3649 = 'P';
  QLatin1String::QLatin1String(&local_3660,"PARENT_DIRECTORY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2ec8,&local_3649,&local_3660);
  local_3661 = 'R';
  QLatin1String::QLatin1String(&local_3678,"RULE_LAUNCH_COMPILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2eb0,&local_3661,&local_3678);
  local_3679 = 'R';
  QLatin1String::QLatin1String(&local_3690,"RULE_LAUNCH_CUSTOM");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2e98,&local_3679,&local_3690);
  local_3691 = 'R';
  QLatin1String::QLatin1String(&local_36a8,"RULE_LAUNCH_LINK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2e80,&local_3691,&local_36a8);
  local_36a9 = 'T';
  QLatin1String::QLatin1String(&local_36c0,"TEST_INCLUDE_FILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2e68,&local_36a9,&local_36c0);
  local_36c1 = 'V';
  QLatin1String::QLatin1String(&local_36d8,"VARIABLES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2e50,&local_36c1,&local_36d8);
  local_36d9 = 'A';
  QLatin1String::QLatin1String(&local_36f0,"ALIASED_TARGET");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2e38,&local_36d9,&local_36f0);
  local_36f1 = 'A';
  QLatin1String::QLatin1String(&local_3708,"ARCHIVE_OUTPUT_DIRECTORY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2e20,&local_36f1,&local_3708);
  local_3709 = 'A';
  QLatin1String::QLatin1String(&local_3720,"ARCHIVE_OUTPUT_NAME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2e08,&local_3709,&local_3720);
  local_3721 = 'A';
  QLatin1String::QLatin1String(&local_3738,"AUTOGEN_TARGET_DEPENDS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2df0,&local_3721,&local_3738);
  local_3739 = 'A';
  QLatin1String::QLatin1String(&local_3750,"AUTOMOC_MOC_OPTIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2dd8,&local_3739,&local_3750);
  local_3751 = 'A';
  QLatin1String::QLatin1String(&local_3768,"AUTOMOC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2dc0,&local_3751,&local_3768);
  local_3769 = 'A';
  QLatin1String::QLatin1String(&local_3780,"AUTOUIC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2da8,&local_3769,&local_3780);
  local_3781 = 'A';
  QLatin1String::QLatin1String(&local_3798,"AUTOUIC_OPTIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2d90,&local_3781,&local_3798);
  local_3799 = 'A';
  QLatin1String::QLatin1String(&local_37b0,"AUTORCC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2d78,&local_3799,&local_37b0);
  local_37b1 = 'A';
  QLatin1String::QLatin1String(&local_37c8,"AUTORCC_OPTIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2d60,&local_37b1,&local_37c8);
  local_37c9 = 'B';
  QLatin1String::QLatin1String(&local_37e0,"BUILD_WITH_INSTALL_RPATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2d48,&local_37c9,&local_37e0);
  local_37e1 = 'B';
  QLatin1String::QLatin1String(&local_37f8,"BUNDLE_EXTENSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2d30,&local_37e1,&local_37f8);
  local_37f9 = 'B';
  QLatin1String::QLatin1String(&local_3810,"BUNDLE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2d18,&local_37f9,&local_3810);
  local_3811 = 'C';
  QLatin1String::QLatin1String(&local_3828,"COMPATIBLE_INTERFACE_BOOL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2d00,&local_3811,&local_3828);
  local_3829 = 'C';
  QLatin1String::QLatin1String(&local_3840,"COMPATIBLE_INTERFACE_NUMBER_MAX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2ce8,&local_3829,&local_3840);
  local_3841 = 'C';
  QLatin1String::QLatin1String(&local_3858,"COMPATIBLE_INTERFACE_NUMBER_MIN");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2cd0,&local_3841,&local_3858);
  local_3859 = 'C';
  QLatin1String::QLatin1String(&local_3870,"COMPATIBLE_INTERFACE_STRING");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2cb8,&local_3859,&local_3870);
  local_3871 = 'C';
  QLatin1String::QLatin1String(&local_3888,"COMPILE_DEFINITIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2ca0,&local_3871,&local_3888);
  local_3889 = 'C';
  QLatin1String::QLatin1String(&local_38a0,"COMPILE_FLAGS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2c88,&local_3889,&local_38a0);
  local_38a1 = 'C';
  QLatin1String::QLatin1String(&local_38b8,"COMPILE_OPTIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2c70,&local_38a1,&local_38b8);
  local_38b9 = 'D';
  QLatin1String::QLatin1String(&local_38d0,"DEBUG_POSTFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2c58,&local_38b9,&local_38d0);
  local_38d1 = 'D';
  QLatin1String::QLatin1String(&local_38e8,"DEFINE_SYMBOL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2c40,&local_38d1,&local_38e8);
  local_38e9 = 'E';
  QLatin1String::QLatin1String(&local_3900,"EchoString");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2c28,&local_38e9,&local_3900);
  local_3901 = 'E';
  QLatin1String::QLatin1String(&local_3918,"ENABLE_EXPORTS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2c10,&local_3901,&local_3918);
  local_3919 = 'E';
  QLatin1String::QLatin1String(&local_3930,"EXCLUDE_FROM_ALL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2bf8,&local_3919,&local_3930);
  local_3931 = 'E';
  QLatin1String::QLatin1String(&local_3948,"EXCLUDE_FROM_DEFAULT_BUILD");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2be0,&local_3931,&local_3948);
  local_3949 = 'E';
  QLatin1String::QLatin1String(&local_3960,"EXPORT_NAME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2bc8,&local_3949,&local_3960);
  local_3961 = 'F';
  QLatin1String::QLatin1String(&local_3978,"FOLDER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2bb0,&local_3961,&local_3978);
  local_3979 = 'F';
  QLatin1String::QLatin1String(&local_3990,"Fortran_FORMAT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2b98,&local_3979,&local_3990);
  local_3991 = 'F';
  QLatin1String::QLatin1String(&local_39a8,"Fortran_MODULE_DIRECTORY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2b80,&local_3991,&local_39a8);
  local_39a9 = 'F';
  QLatin1String::QLatin1String(&local_39c0,"FRAMEWORK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2b68,&local_39a9,&local_39c0);
  local_39c1 = 'G';
  QLatin1String::QLatin1String(&local_39d8,"GENERATOR_FILE_NAME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2b50,&local_39c1,&local_39d8);
  local_39d9 = 'G';
  QLatin1String::QLatin1String(&local_39f0,"GNUtoMS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2b38,&local_39d9,&local_39f0);
  local_39f1 = 'H';
  QLatin1String::QLatin1String(&local_3a08,"HAS_CXX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2b20,&local_39f1,&local_3a08);
  local_3a09 = 'I';
  QLatin1String::QLatin1String(&local_3a20,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2b08,&local_3a09,&local_3a20);
  local_3a21 = 'I';
  QLatin1String::QLatin1String(&local_3a38,"IMPORTED_CONFIGURATIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2af0,&local_3a21,&local_3a38);
  local_3a39 = 'I';
  QLatin1String::QLatin1String(&local_3a50,"IMPORTED_IMPLIB");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2ad8,&local_3a39,&local_3a50);
  local_3a51 = 'I';
  QLatin1String::QLatin1String(&local_3a68,"IMPORTED_LINK_DEPENDENT_LIBRARIES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2ac0,&local_3a51,&local_3a68);
  local_3a69 = 'I';
  QLatin1String::QLatin1String(&local_3a80,"IMPORTED_LINK_INTERFACE_LANGUAGES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2aa8,&local_3a69,&local_3a80);
  local_3a81 = 'I';
  QLatin1String::QLatin1String(&local_3a98,"IMPORTED_LINK_INTERFACE_LIBRARIES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2a90,&local_3a81,&local_3a98);
  local_3a99 = 'I';
  QLatin1String::QLatin1String(&local_3ab0,"IMPORTED_LINK_INTERFACE_MULTIPLICITY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2a78,&local_3a99,&local_3ab0);
  local_3ab1 = 'I';
  QLatin1String::QLatin1String(&local_3ac8,"IMPORTED_LOCATION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2a60,&local_3ab1,&local_3ac8);
  local_3ac9 = 'I';
  QLatin1String::QLatin1String(&local_3ae0,"IMPORTED_NO_SONAME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2a48,&local_3ac9,&local_3ae0);
  local_3ae1 = 'I';
  QLatin1String::QLatin1String(&local_3af8,"IMPORTED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2a30,&local_3ae1,&local_3af8);
  local_3af9 = 'I';
  QLatin1String::QLatin1String(&local_3b10,"IMPORTED_SONAME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2a18,&local_3af9,&local_3b10);
  local_3b11 = 'I';
  QLatin1String::QLatin1String(&local_3b28,"IMPORT_PREFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2a00,&local_3b11,&local_3b28);
  local_3b29 = 'I';
  QLatin1String::QLatin1String(&local_3b40,"IMPORT_SUFFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_29e8,&local_3b29,&local_3b40);
  local_3b41 = 'I';
  QLatin1String::QLatin1String(&local_3b58,"INCLUDE_DIRECTORIES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_29d0,&local_3b41,&local_3b58);
  local_3b59 = 'I';
  QLatin1String::QLatin1String(&local_3b70,"INSTALL_NAME_DIR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_29b8,&local_3b59,&local_3b70);
  local_3b71 = 'I';
  QLatin1String::QLatin1String(&local_3b88,"INSTALL_RPATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_29a0,&local_3b71,&local_3b88);
  local_3b89 = 'I';
  QLatin1String::QLatin1String(&local_3ba0,"INSTALL_RPATH_USE_LINK_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2988,&local_3b89,&local_3ba0);
  local_3ba1 = 'I';
  QLatin1String::QLatin1String(&local_3bb8,"INTERFACE_AUTOUIC_OPTIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2970,&local_3ba1,&local_3bb8);
  local_3bb9 = 'I';
  QLatin1String::QLatin1String(&local_3bd0,"INTERFACE_COMPILE_DEFINITIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2958,&local_3bb9,&local_3bd0);
  local_3bd1 = 'I';
  QLatin1String::QLatin1String(&local_3be8,"INTERFACE_COMPILE_OPTIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2940,&local_3bd1,&local_3be8);
  local_3be9 = 'I';
  QLatin1String::QLatin1String(&local_3c00,"INTERFACE_INCLUDE_DIRECTORIES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2928,&local_3be9,&local_3c00);
  local_3c01 = 'I';
  QLatin1String::QLatin1String(&local_3c18,"INTERFACE_LINK_LIBRARIES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2910,&local_3c01,&local_3c18);
  local_3c19 = 'I';
  QLatin1String::QLatin1String(&local_3c30,"INTERFACE_POSITION_INDEPENDENT_CODE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_28f8,&local_3c19,&local_3c30);
  local_3c31 = 'I';
  QLatin1String::QLatin1String(&local_3c48,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_28e0,&local_3c31,&local_3c48);
  local_3c49 = 'I';
  QLatin1String::QLatin1String(&local_3c60,"INTERPROCEDURAL_OPTIMIZATION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_28c8,&local_3c49,&local_3c60);
  local_3c61 = 'J';
  QLatin1String::QLatin1String(&local_3c78,"JOB_POOL_COMPILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_28b0,&local_3c61,&local_3c78);
  local_3c79 = 'J';
  QLatin1String::QLatin1String(&local_3c90,"JOB_POOL_LINK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2898,&local_3c79,&local_3c90);
  local_3c91 = 'L';
  QLatin1String::QLatin1String(&local_3ca8,"LABELS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2880,&local_3c91,&local_3ca8);
  local_3ca9 = 'L';
  QLatin1String::QLatin1String(&local_3cc0,"LIBRARY_OUTPUT_DIRECTORY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2868,&local_3ca9,&local_3cc0);
  local_3cc1 = 'L';
  QLatin1String::QLatin1String(&local_3cd8,"LIBRARY_OUTPUT_NAME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2850,&local_3cc1,&local_3cd8);
  local_3cd9 = 'L';
  QLatin1String::QLatin1String(&local_3cf0,"LINK_DEPENDS_NO_SHARED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2838,&local_3cd9,&local_3cf0);
  local_3cf1 = 'L';
  QLatin1String::QLatin1String(&local_3d08,"LINK_DEPENDS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2820,&local_3cf1,&local_3d08);
  local_3d09 = 'L';
  QLatin1String::QLatin1String(&local_3d20,"LINKER_LANGUAGE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2808,&local_3d09,&local_3d20);
  local_3d21 = 'L';
  QLatin1String::QLatin1String(&local_3d38,"LINK_FLAGS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_27f0,&local_3d21,&local_3d38);
  local_3d39 = 'L';
  QLatin1String::QLatin1String(&local_3d50,"LINK_INTERFACE_LIBRARIES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_27d8,&local_3d39,&local_3d50);
  local_3d51 = 'L';
  QLatin1String::QLatin1String(&local_3d68,"LINK_INTERFACE_MULTIPLICITY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_27c0,&local_3d51,&local_3d68);
  local_3d69 = 'L';
  QLatin1String::QLatin1String(&local_3d80,"LINK_LIBRARIES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_27a8,&local_3d69,&local_3d80);
  local_3d81 = 'L';
  QLatin1String::QLatin1String(&local_3d98,"LINK_SEARCH_END_STATIC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2790,&local_3d81,&local_3d98);
  local_3d99 = 'L';
  QLatin1String::QLatin1String(&local_3db0,"LINK_SEARCH_START_STATIC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2778,&local_3d99,&local_3db0);
  local_3db1 = 'L';
  QLatin1String::QLatin1String(&local_3dc8,"LOCATION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2760,&local_3db1,&local_3dc8);
  local_3dc9 = 'M';
  QLatin1String::QLatin1String(&local_3de0,"MACOSX_BUNDLE_INFO_PLIST");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2748,&local_3dc9,&local_3de0);
  local_3de1 = 'M';
  QLatin1String::QLatin1String(&local_3df8,"MACOSX_BUNDLE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2730,&local_3de1,&local_3df8);
  local_3df9 = 'M';
  QLatin1String::QLatin1String(&local_3e10,"MACOSX_FRAMEWORK_INFO_PLIST");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2718,&local_3df9,&local_3e10);
  local_3e11 = 'M';
  QLatin1String::QLatin1String(&local_3e28,"MACOSX_RPATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2700,&local_3e11,&local_3e28);
  local_3e29 = 'N';
  QLatin1String::QLatin1String(&local_3e40,"NO_SONAME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_26e8,&local_3e29,&local_3e40);
  local_3e41 = 'N';
  QLatin1String::QLatin1String(&local_3e58,"NO_SYSTEM_FROM_IMPORTED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_26d0,&local_3e41,&local_3e58);
  local_3e59 = 'O';
  QLatin1String::QLatin1String(&local_3e70,"OSX_ARCHITECTURES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_26b8,&local_3e59,&local_3e70);
  local_3e71 = 'O';
  QLatin1String::QLatin1String(&local_3e88,"OUTPUT_NAME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_26a0,&local_3e71,&local_3e88);
  local_3e89 = 'P';
  QLatin1String::QLatin1String(&local_3ea0,"PDB_NAME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2688,&local_3e89,&local_3ea0);
  local_3ea1 = 'P';
  QLatin1String::QLatin1String(&local_3eb8,"PDB_OUTPUT_DIRECTORY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2670,&local_3ea1,&local_3eb8);
  local_3eb9 = 'P';
  QLatin1String::QLatin1String(&local_3ed0,"POSITION_INDEPENDENT_CODE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2658,&local_3eb9,&local_3ed0);
  local_3ed1 = 'P';
  QLatin1String::QLatin1String(&local_3ee8,"POST_INSTALL_SCRIPT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2640,&local_3ed1,&local_3ee8);
  local_3ee9 = 'P';
  QLatin1String::QLatin1String(&local_3f00,"PREFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2628,&local_3ee9,&local_3f00);
  local_3f01 = 'P';
  QLatin1String::QLatin1String(&local_3f18,"PROPERTY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2610,&local_3f01,&local_3f18);
  local_3f19 = 'P';
  QLatin1String::QLatin1String(&local_3f30,"PRE_INSTALL_SCRIPT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_25f8,&local_3f19,&local_3f30);
  local_3f31 = 'P';
  QLatin1String::QLatin1String(&local_3f48,"PRIVATE_HEADER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_25e0,&local_3f31,&local_3f48);
  local_3f49 = 'P';
  QLatin1String::QLatin1String(&local_3f60,"PROJECT_LABEL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_25c8,&local_3f49,&local_3f60);
  local_3f61 = 'P';
  QLatin1String::QLatin1String(&local_3f78,"PUBLIC_HEADER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_25b0,&local_3f61,&local_3f78);
  local_3f79 = 'R';
  QLatin1String::QLatin1String(&local_3f90,"RESOURCE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2598,&local_3f79,&local_3f90);
  local_3f91 = 'R';
  QLatin1String::QLatin1String(&local_3fa8,"RULE_LAUNCH_COMPILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2580,&local_3f91,&local_3fa8);
  local_3fa9 = 'R';
  QLatin1String::QLatin1String(&local_3fc0,"RULE_LAUNCH_CUSTOM");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2568,&local_3fa9,&local_3fc0);
  local_3fc1 = 'R';
  QLatin1String::QLatin1String(&local_3fd8,"RULE_LAUNCH_LINK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2550,&local_3fc1,&local_3fd8);
  local_3fd9 = 'R';
  QLatin1String::QLatin1String(&local_3ff0,"RUNTIME_OUTPUT_DIRECTORY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2538,&local_3fd9,&local_3ff0);
  local_3ff1 = 'R';
  QLatin1String::QLatin1String(&local_4008,"RUNTIME_OUTPUT_NAME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2520,&local_3ff1,&local_4008);
  local_4009 = 'S';
  QLatin1String::QLatin1String(&local_4020,"SKIP_BUILD_RPATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2508,&local_4009,&local_4020);
  local_4021 = 'S';
  QLatin1String::QLatin1String(&local_4038,"SOURCES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_24f0,&local_4021,&local_4038);
  local_4039 = 'S';
  QLatin1String::QLatin1String(&local_4050,"SOVERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_24d8,&local_4039,&local_4050);
  local_4051 = 'S';
  QLatin1String::QLatin1String(&local_4068,"STATIC_LIBRARY_FLAGS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_24c0,&local_4051,&local_4068);
  local_4069 = 'S';
  QLatin1String::QLatin1String(&local_4080,"SUFFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_24a8,&local_4069,&local_4080);
  local_4081 = 'T';
  QLatin1String::QLatin1String(&local_4098,"TARGET");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2490,&local_4081,&local_4098);
  local_4099 = 'T';
  QLatin1String::QLatin1String(&local_40b0,"TYPE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2478,&local_4099,&local_40b0);
  local_40b1 = 'V';
  QLatin1String::QLatin1String(&local_40c8,"VERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2460,&local_40b1,&local_40c8);
  local_40c9 = 'V';
  QLatin1String::QLatin1String(&local_40e0,"VISIBILITY_INLINES_HIDDEN");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2448,&local_40c9,&local_40e0);
  local_40e1 = 'V';
  QLatin1String::QLatin1String(&local_40f8,"VS_DOTNET_REFERENCES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2430,&local_40e1,&local_40f8);
  local_40f9 = 'V';
  QLatin1String::QLatin1String(&local_4110,"VS_DOTNET_TARGET_FRAMEWORK_VERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2418,&local_40f9,&local_4110);
  local_4111 = 'V';
  QLatin1String::QLatin1String(&local_4128,"VS_GLOBAL_KEYWORD");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2400,&local_4111,&local_4128);
  local_4129 = 'V';
  QLatin1String::QLatin1String(&local_4140,"VS_GLOBAL_PROJECT_TYPES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_23e8,&local_4129,&local_4140);
  local_4141 = 'V';
  QLatin1String::QLatin1String(&local_4158,"VS_GLOBAL_ROOTNAMESPACE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_23d0,&local_4141,&local_4158);
  local_4159 = 'V';
  QLatin1String::QLatin1String(&local_4170,"VS_KEYWORD");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_23b8,&local_4159,&local_4170);
  local_4171 = 'V';
  QLatin1String::QLatin1String(&local_4188,"VS_SCC_AUXPATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_23a0,&local_4171,&local_4188);
  local_4189 = 'V';
  QLatin1String::QLatin1String(&local_41a0,"VS_SCC_LOCALPATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2388,&local_4189,&local_41a0);
  local_41a1 = 'V';
  QLatin1String::QLatin1String(&local_41b8,"VS_SCC_PROJECTNAME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2370,&local_41a1,&local_41b8);
  local_41b9 = 'V';
  QLatin1String::QLatin1String(&local_41d0,"VS_SCC_PROVIDER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2358,&local_41b9,&local_41d0);
  local_41d1 = 'V';
  QLatin1String::QLatin1String(&local_41e8,"VS_WINRT_EXTENSIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2340,&local_41d1,&local_41e8);
  local_41e9 = 'V';
  QLatin1String::QLatin1String(&local_4200,"VS_WINRT_REFERENCES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2328,&local_41e9,&local_4200);
  local_4201 = 'W';
  QLatin1String::QLatin1String(&local_4218,"WIN32_EXECUTABLE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2310,&local_4201,&local_4218);
  local_4219 = 'A';
  QLatin1String::QLatin1String(&local_4230,"ATTACHED_FILES_ON_FAIL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_22f8,&local_4219,&local_4230);
  local_4231 = 'A';
  QLatin1String::QLatin1String(&local_4248,"ATTACHED_FILES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_22e0,&local_4231,&local_4248);
  local_4249 = 'C';
  QLatin1String::QLatin1String(&local_4260,"COST");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_22c8,&local_4249,&local_4260);
  local_4261 = 'D';
  QLatin1String::QLatin1String(&local_4278,"DEPENDS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_22b0,&local_4261,&local_4278);
  local_4279 = 'E';
  QLatin1String::QLatin1String(&local_4290,"ENVIRONMENT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2298,&local_4279,&local_4290);
  local_4291 = 'F';
  QLatin1String::QLatin1String(&local_42a8,"FAIL_REGULAR_EXPRESSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2280,&local_4291,&local_42a8);
  local_42a9 = 'L';
  QLatin1String::QLatin1String(&local_42c0,"LABELS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2268,&local_42a9,&local_42c0);
  local_42c1 = 'M';
  QLatin1String::QLatin1String(&local_42d8,"MEASUREMENT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2250,&local_42c1,&local_42d8);
  local_42d9 = 'P';
  QLatin1String::QLatin1String(&local_42f0,"PASS_REGULAR_EXPRESSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2238,&local_42d9,&local_42f0);
  local_42f1 = 'P';
  QLatin1String::QLatin1String(&local_4308,"PROCESSORS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2220,&local_42f1,&local_4308);
  local_4309 = 'R';
  QLatin1String::QLatin1String(&local_4320,"REQUIRED_FILES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2208,&local_4309,&local_4320);
  local_4321 = 'R';
  QLatin1String::QLatin1String(&local_4338,"RESOURCE_LOCK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_21f0,&local_4321,&local_4338);
  local_4339 = 'R';
  QLatin1String::QLatin1String(&local_4350,"RUN_SERIAL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_21d8,&local_4339,&local_4350);
  local_4351 = 'S';
  QLatin1String::QLatin1String(&local_4368,"SKIP_RETURN_CODE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_21c0,&local_4351,&local_4368);
  local_4369 = 'T';
  QLatin1String::QLatin1String(&local_4380,"TIMEOUT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_21a8,&local_4369,&local_4380);
  local_4381 = 'W';
  QLatin1String::QLatin1String(&local_4398,"WILL_FAIL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2190,&local_4381,&local_4398);
  local_4399 = 'W';
  QLatin1String::QLatin1String(&local_43b0,"WORKING_DIRECTORY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2178,&local_4399,&local_43b0);
  local_43b1 = 'A';
  QLatin1String::QLatin1String(&local_43c8,"ABSTRACT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2160,&local_43b1,&local_43c8);
  local_43c9 = 'A';
  QLatin1String::QLatin1String(&local_43e0,"AUTOUIC_OPTIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2148,&local_43c9,&local_43e0);
  local_43e1 = 'A';
  QLatin1String::QLatin1String(&local_43f8,"AUTORCC_OPTIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2130,&local_43e1,&local_43f8);
  local_43f9 = 'C';
  QLatin1String::QLatin1String(&local_4410,"COMPILE_DEFINITIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2118,&local_43f9,&local_4410);
  local_4411 = 'C';
  QLatin1String::QLatin1String(&local_4428,"COMPILE_FLAGS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2100,&local_4411,&local_4428);
  local_4429 = 'E';
  QLatin1String::QLatin1String(&local_4440,"EXTERNAL_OBJECT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_20e8,&local_4429,&local_4440);
  local_4441 = 'F';
  QLatin1String::QLatin1String(&local_4458,"Fortran_FORMAT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_20d0,&local_4441,&local_4458);
  local_4459 = 'G';
  QLatin1String::QLatin1String(&local_4470,"GENERATED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_20b8,&local_4459,&local_4470);
  local_4471 = 'H';
  QLatin1String::QLatin1String(&local_4488,"HEADER_FILE_ONLY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_20a0,&local_4471,&local_4488);
  local_4489 = 'K';
  QLatin1String::QLatin1String(&local_44a0,"KEEP_EXTENSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2088,&local_4489,&local_44a0);
  local_44a1 = 'L';
  QLatin1String::QLatin1String(&local_44b8,"LABELS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2070,&local_44a1,&local_44b8);
  local_44b9 = 'L';
  QLatin1String::QLatin1String(&local_44d0,"LOCATION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2058,&local_44b9,&local_44d0);
  local_44d1 = 'M';
  QLatin1String::QLatin1String(&local_44e8,"MACOSX_PACKAGE_LOCATION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2040,&local_44d1,&local_44e8);
  local_44e9 = 'O';
  QLatin1String::QLatin1String(&local_4500,"OBJECT_DEPENDS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2028,&local_44e9,&local_4500);
  local_4501 = 'O';
  QLatin1String::QLatin1String(&local_4518,"OBJECT_OUTPUTS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2010,&local_4501,&local_4518);
  local_4519 = 'S';
  QLatin1String::QLatin1String(&local_4530,"SYMBOLIC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1ff8,&local_4519,&local_4530);
  local_4531 = 'W';
  QLatin1String::QLatin1String(&local_4548,"WRAP_EXCLUDE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1fe0,&local_4531,&local_4548);
  local_4549 = 'A';
  QLatin1String::QLatin1String(&local_4560,"ADVANCED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1fc8,&local_4549,&local_4560);
  local_4561 = 'H';
  QLatin1String::QLatin1String(&local_4578,"HELPSTRING");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1fb0,&local_4561,&local_4578);
  local_4579 = 'M';
  QLatin1String::QLatin1String(&local_4590,"MODIFIED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1f98,&local_4579,&local_4590);
  local_4591 = 'S';
  QLatin1String::QLatin1String(&local_45a8,"STRINGS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1f80,&local_4591,&local_45a8);
  local_45a9 = 'T';
  QLatin1String::QLatin1String(&local_45c0,"TYPE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1f68,&local_45a9,&local_45c0);
  local_45c1 = 'V';
  QLatin1String::QLatin1String(&local_45d8,"VALUE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1f50,&local_45c1,&local_45d8);
  local_1f38 = &local_3288;
  local_1f30 = 0xce;
  list_00._M_len = 0xce;
  list_00._M_array = local_1f38;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_1f28,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&cmake_builtin,&local_1f28);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_1f28);
  local_5931 = 'C';
  QLatin1String::QLatin1String(&local_5948,"CMAKE_ARGC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&local_5930,&local_5931,&local_5948);
  local_5949 = 'C';
  QLatin1String::QLatin1String(&local_5960,"CMAKE_ARGV0");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5918,&local_5949,&local_5960);
  local_5961 = 'C';
  QLatin1String::QLatin1String(&local_5978,"CMAKE_AR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5900,&local_5961,&local_5978);
  local_5979 = 'C';
  QLatin1String::QLatin1String(&local_5990,"CMAKE_BINARY_DIR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_58e8,&local_5979,&local_5990);
  local_5991 = 'C';
  QLatin1String::QLatin1String(&local_59a8,"CMAKE_BUILD_TOOL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_58d0,&local_5991,&local_59a8);
  local_59a9 = 'C';
  QLatin1String::QLatin1String(&local_59c0,"CMAKE_CACHEFILE_DIR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_58b8,&local_59a9,&local_59c0);
  local_59c1 = 'C';
  QLatin1String::QLatin1String(&local_59d8,"CMAKE_CACHE_MAJOR_VERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_58a0,&local_59c1,&local_59d8);
  local_59d9 = 'C';
  QLatin1String::QLatin1String(&local_59f0,"CMAKE_CACHE_MINOR_VERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5888,&local_59d9,&local_59f0);
  local_59f1 = 'C';
  QLatin1String::QLatin1String(&local_5a08,"CMAKE_CACHE_PATCH_VERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5870,&local_59f1,&local_5a08);
  local_5a09 = 'C';
  QLatin1String::QLatin1String(&local_5a20,"CMAKE_CFG_INTDIR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5858,&local_5a09,&local_5a20);
  local_5a21 = 'C';
  QLatin1String::QLatin1String(&local_5a38,"CMAKE_COMMAND");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5840,&local_5a21,&local_5a38);
  local_5a39 = 'C';
  QLatin1String::QLatin1String(&local_5a50,"CMAKE_CROSSCOMPILING");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5828,&local_5a39,&local_5a50);
  local_5a51 = 'C';
  QLatin1String::QLatin1String(&local_5a68,"CMAKE_CTEST_COMMAND");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5810,&local_5a51,&local_5a68);
  local_5a69 = 'C';
  QLatin1String::QLatin1String(&local_5a80,"CMAKE_CURRENT_BINARY_DIR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_57f8,&local_5a69,&local_5a80);
  local_5a81 = 'C';
  QLatin1String::QLatin1String(&local_5a98,"CMAKE_CURRENT_LIST_DIR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_57e0,&local_5a81,&local_5a98);
  local_5a99 = 'C';
  QLatin1String::QLatin1String(&local_5ab0,"CMAKE_CURRENT_LIST_FILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_57c8,&local_5a99,&local_5ab0);
  local_5ab1 = 'C';
  QLatin1String::QLatin1String(&local_5ac8,"CMAKE_CURRENT_LIST_LINE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_57b0,&local_5ab1,&local_5ac8);
  local_5ac9 = 'C';
  QLatin1String::QLatin1String(&local_5ae0,"CMAKE_CURRENT_SOURCE_DIR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5798,&local_5ac9,&local_5ae0);
  local_5ae1 = 'C';
  QLatin1String::QLatin1String(&local_5af8,"CMAKE_DL_LIBS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5780,&local_5ae1,&local_5af8);
  local_5af9 = 'C';
  QLatin1String::QLatin1String(&local_5b10,"CMAKE_EDIT_COMMAND");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5768,&local_5af9,&local_5b10);
  local_5b11 = 'C';
  QLatin1String::QLatin1String(&local_5b28,"CMAKE_EXECUTABLE_SUFFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5750,&local_5b11,&local_5b28);
  local_5b29 = 'C';
  QLatin1String::QLatin1String(&local_5b40,"CMAKE_EXTRA_GENERATOR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5738,&local_5b29,&local_5b40);
  local_5b41 = 'C';
  QLatin1String::QLatin1String(&local_5b58,"CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5720,&local_5b41,&local_5b58);
  local_5b59 = 'C';
  QLatin1String::QLatin1String(&local_5b70,"CMAKE_GENERATOR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5708,&local_5b59,&local_5b70);
  local_5b71 = 'C';
  QLatin1String::QLatin1String(&local_5b88,"CMAKE_GENERATOR_TOOLSET");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_56f0,&local_5b71,&local_5b88);
  local_5b89 = 'C';
  QLatin1String::QLatin1String(&local_5ba0,"CMAKE_HOME_DIRECTORY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_56d8,&local_5b89,&local_5ba0);
  local_5ba1 = 'C';
  QLatin1String::QLatin1String(&local_5bb8,"CMAKE_IMPORT_LIBRARY_PREFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_56c0,&local_5ba1,&local_5bb8);
  local_5bb9 = 'C';
  QLatin1String::QLatin1String(&local_5bd0,"CMAKE_IMPORT_LIBRARY_SUFFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_56a8,&local_5bb9,&local_5bd0);
  local_5bd1 = 'C';
  QLatin1String::QLatin1String(&local_5be8,"CMAKE_JOB_POOL_COMPILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5690,&local_5bd1,&local_5be8);
  local_5be9 = 'C';
  QLatin1String::QLatin1String(&local_5c00,"CMAKE_JOB_POOL_LINK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5678,&local_5be9,&local_5c00);
  local_5c01 = 'C';
  QLatin1String::QLatin1String(&local_5c18,"CMAKE_LINK_LIBRARY_SUFFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5660,&local_5c01,&local_5c18);
  local_5c19 = 'C';
  QLatin1String::QLatin1String(&local_5c30,"CMAKE_MAJOR_VERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5648,&local_5c19,&local_5c30);
  local_5c31 = 'C';
  QLatin1String::QLatin1String(&local_5c48,"CMAKE_MAKE_PROGRAM");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5630,&local_5c31,&local_5c48);
  local_5c49 = 'C';
  QLatin1String::QLatin1String(&local_5c60,"CMAKE_MINIMUM_REQUIRED_VERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5618,&local_5c49,&local_5c60);
  local_5c61 = 'C';
  QLatin1String::QLatin1String(&local_5c78,"CMAKE_MINOR_VERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5600,&local_5c61,&local_5c78);
  local_5c79 = 'C';
  QLatin1String::QLatin1String(&local_5c90,"CMAKE_PARENT_LIST_FILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_55e8,&local_5c79,&local_5c90);
  local_5c91 = 'C';
  QLatin1String::QLatin1String(&local_5ca8,"CMAKE_PATCH_VERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_55d0,&local_5c91,&local_5ca8);
  local_5ca9 = 'C';
  QLatin1String::QLatin1String(&local_5cc0,"CMAKE_PROJECT_NAME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_55b8,&local_5ca9,&local_5cc0);
  local_5cc1 = 'C';
  QLatin1String::QLatin1String(&local_5cd8,"CMAKE_RANLIB");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_55a0,&local_5cc1,&local_5cd8);
  local_5cd9 = 'C';
  QLatin1String::QLatin1String(&local_5cf0,"CMAKE_ROOT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5588,&local_5cd9,&local_5cf0);
  local_5cf1 = 'C';
  QLatin1String::QLatin1String(&local_5d08,"CMAKE_SCRIPT_MODE_FILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5570,&local_5cf1,&local_5d08);
  local_5d09 = 'C';
  QLatin1String::QLatin1String(&local_5d20,"CMAKE_SHARED_LIBRARY_PREFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5558,&local_5d09,&local_5d20);
  local_5d21 = 'C';
  QLatin1String::QLatin1String(&local_5d38,"CMAKE_SHARED_LIBRARY_SUFFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5540,&local_5d21,&local_5d38);
  local_5d39 = 'C';
  QLatin1String::QLatin1String(&local_5d50,"CMAKE_SHARED_MODULE_PREFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5528,&local_5d39,&local_5d50);
  local_5d51 = 'C';
  QLatin1String::QLatin1String(&local_5d68,"CMAKE_SHARED_MODULE_SUFFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5510,&local_5d51,&local_5d68);
  local_5d69 = 'C';
  QLatin1String::QLatin1String(&local_5d80,"CMAKE_SIZEOF_VOID_P");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_54f8,&local_5d69,&local_5d80);
  local_5d81 = 'C';
  QLatin1String::QLatin1String(&local_5d98,"CMAKE_SKIP_INSTALL_RULES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_54e0,&local_5d81,&local_5d98);
  local_5d99 = 'C';
  QLatin1String::QLatin1String(&local_5db0,"CMAKE_SKIP_RPATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_54c8,&local_5d99,&local_5db0);
  local_5db1 = 'C';
  QLatin1String::QLatin1String(&local_5dc8,"CMAKE_SOURCE_DIR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_54b0,&local_5db1,&local_5dc8);
  local_5dc9 = 'C';
  QLatin1String::QLatin1String(&local_5de0,"CMAKE_STANDARD_LIBRARIES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5498,&local_5dc9,&local_5de0);
  local_5de1 = 'C';
  QLatin1String::QLatin1String(&local_5df8,"CMAKE_STATIC_LIBRARY_PREFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5480,&local_5de1,&local_5df8);
  local_5df9 = 'C';
  QLatin1String::QLatin1String(&local_5e10,"CMAKE_STATIC_LIBRARY_SUFFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5468,&local_5df9,&local_5e10);
  local_5e11 = 'C';
  QLatin1String::QLatin1String(&local_5e28,"CMAKE_TOOLCHAIN_FILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5450,&local_5e11,&local_5e28);
  local_5e29 = 'C';
  QLatin1String::QLatin1String(&local_5e40,"CMAKE_TWEAK_VERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5438,&local_5e29,&local_5e40);
  local_5e41 = 'C';
  QLatin1String::QLatin1String(&local_5e58,"CMAKE_VERBOSE_MAKEFILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5420,&local_5e41,&local_5e58);
  local_5e59 = 'C';
  QLatin1String::QLatin1String(&local_5e70,"CMAKE_VERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5408,&local_5e59,&local_5e70);
  local_5e71 = 'C';
  QLatin1String::QLatin1String(&local_5e88,"CMAKE_VS_DEVENV_COMMAND");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_53f0,&local_5e71,&local_5e88);
  local_5e89 = 'C';
  QLatin1String::QLatin1String(&local_5ea0,"CMAKE_VS_INTEL_Fortran_PROJECT_VERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_53d8,&local_5e89,&local_5ea0);
  local_5ea1 = 'C';
  QLatin1String::QLatin1String(&local_5eb8,"CMAKE_VS_MSBUILD_COMMAND");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_53c0,&local_5ea1,&local_5eb8);
  local_5eb9 = 'C';
  QLatin1String::QLatin1String(&local_5ed0,"CMAKE_VS_MSDEV_COMMAND");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_53a8,&local_5eb9,&local_5ed0);
  local_5ed1 = 'C';
  QLatin1String::QLatin1String(&local_5ee8,"CMAKE_VS_PLATFORM_TOOLSET");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5390,&local_5ed1,&local_5ee8);
  local_5ee9 = 'C';
  QLatin1String::QLatin1String(&local_5f00,"CMAKE_XCODE_PLATFORM_TOOLSET");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5378,&local_5ee9,&local_5f00);
  local_5f01 = 'P';
  QLatin1String::QLatin1String(&local_5f18,"PROJECT_BINARY_DIR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5360,&local_5f01,&local_5f18);
  local_5f19 = 'P';
  QLatin1String::QLatin1String(&local_5f30,"PROJECT_SOURCE_DIR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5348,&local_5f19,&local_5f30);
  local_5f31 = 'P';
  QLatin1String::QLatin1String(&local_5f48,"PROJECT_VERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5330,&local_5f31,&local_5f48);
  local_5f49 = 'P';
  QLatin1String::QLatin1String(&local_5f60,"PROJECT_VERSION_MAJOR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5318,&local_5f49,&local_5f60);
  local_5f61 = 'P';
  QLatin1String::QLatin1String(&local_5f78,"PROJECT_VERSION_MINOR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5300,&local_5f61,&local_5f78);
  local_5f79 = 'P';
  QLatin1String::QLatin1String(&local_5f90,"PROJECT_VERSION_PATCH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_52e8,&local_5f79,&local_5f90);
  local_5f91 = 'P';
  QLatin1String::QLatin1String(&local_5fa8,"PROJECT_VERSION_TWEAK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_52d0,&local_5f91,&local_5fa8);
  local_5fa9 = 'B';
  QLatin1String::QLatin1String(&local_5fc0,"BUILD_SHARED_LIBS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_52b8,&local_5fa9,&local_5fc0);
  local_5fc1 = 'C';
  QLatin1String::QLatin1String(&local_5fd8,"CMAKE_ABSOLUTE_DESTINATION_FILES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_52a0,&local_5fc1,&local_5fd8);
  local_5fd9 = 'C';
  QLatin1String::QLatin1String(&local_5ff0,"CMAKE_APPBUNDLE_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5288,&local_5fd9,&local_5ff0);
  local_5ff1 = 'C';
  QLatin1String::QLatin1String(&local_6008,"CMAKE_AUTOMOC_RELAXED_MODE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5270,&local_5ff1,&local_6008);
  local_6009 = 'C';
  QLatin1String::QLatin1String(&local_6020,"CMAKE_BACKWARDS_COMPATIBILITY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5258,&local_6009,&local_6020);
  local_6021 = 'C';
  QLatin1String::QLatin1String(&local_6038,"CMAKE_BUILD_TYPE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5240,&local_6021,&local_6038);
  local_6039 = 'C';
  QLatin1String::QLatin1String(&local_6050,"CMAKE_COLOR_MAKEFILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5228,&local_6039,&local_6050);
  local_6051 = 'C';
  QLatin1String::QLatin1String(&local_6068,"CMAKE_CONFIGURATION_TYPES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5210,&local_6051,&local_6068);
  local_6069 = 'C';
  QLatin1String::QLatin1String(&local_6080,"CMAKE_DEBUG_TARGET_PROPERTIES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_51f8,&local_6069,&local_6080);
  local_6081 = 'C';
  QLatin1String::QLatin1String(&local_6098,"CMAKE_ERROR_DEPRECATED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_51e0,&local_6081,&local_6098);
  local_6099 = 'C';
  QLatin1String::QLatin1String(&local_60b0,"CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_51c8,&local_6099,&local_60b0);
  local_60b1 = 'C';
  QLatin1String::QLatin1String(&local_60c8,"CMAKE_SYSROOT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_51b0,&local_60b1,&local_60c8);
  local_60c9 = 'C';
  QLatin1String::QLatin1String(&local_60e0,"CMAKE_FIND_LIBRARY_PREFIXES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5198,&local_60c9,&local_60e0);
  local_60e1 = 'C';
  QLatin1String::QLatin1String(&local_60f8,"CMAKE_FIND_LIBRARY_SUFFIXES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5180,&local_60e1,&local_60f8);
  local_60f9 = 'C';
  QLatin1String::QLatin1String(&local_6110,"CMAKE_FIND_NO_INSTALL_PREFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5168,&local_60f9,&local_6110);
  local_6111 = 'C';
  QLatin1String::QLatin1String(&local_6128,"CMAKE_FIND_PACKAGE_WARN_NO_MODULE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5150,&local_6111,&local_6128);
  local_6129 = 'C';
  QLatin1String::QLatin1String(&local_6140,"CMAKE_FIND_ROOT_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5138,&local_6129,&local_6140);
  local_6141 = 'C';
  QLatin1String::QLatin1String(&local_6158,"CMAKE_FIND_ROOT_PATH_MODE_INCLUDE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5120,&local_6141,&local_6158);
  local_6159 = 'C';
  QLatin1String::QLatin1String(&local_6170,"CMAKE_FIND_ROOT_PATH_MODE_LIBRARY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5108,&local_6159,&local_6170);
  local_6171 = 'C';
  QLatin1String::QLatin1String(&local_6188,"CMAKE_FIND_ROOT_PATH_MODE_PACKAGE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_50f0,&local_6171,&local_6188);
  local_6189 = 'C';
  QLatin1String::QLatin1String(&local_61a0,"CMAKE_FIND_ROOT_PATH_MODE_PROGRAM");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_50d8,&local_6189,&local_61a0);
  local_61a1 = 'C';
  QLatin1String::QLatin1String(&local_61b8,"CMAKE_FRAMEWORK_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_50c0,&local_61a1,&local_61b8);
  local_61b9 = 'C';
  QLatin1String::QLatin1String(&local_61d0,"CMAKE_IGNORE_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_50a8,&local_61b9,&local_61d0);
  local_61d1 = 'C';
  QLatin1String::QLatin1String(&local_61e8,"CMAKE_INCLUDE_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5090,&local_61d1,&local_61e8);
  local_61e9 = 'C';
  QLatin1String::QLatin1String(&local_6200,"CMAKE_INCLUDE_DIRECTORIES_BEFORE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5078,&local_61e9,&local_6200);
  local_6201 = 'C';
  QLatin1String::QLatin1String(&local_6218,"CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5060,&local_6201,&local_6218);
  local_6219 = 'C';
  QLatin1String::QLatin1String(&local_6230,"CMAKE_INSTALL_DEFAULT_COMPONENT_NAME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5048,&local_6219,&local_6230);
  local_6231 = 'C';
  QLatin1String::QLatin1String(&local_6248,"CMAKE_INSTALL_PREFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5030,&local_6231,&local_6248);
  local_6249 = 'C';
  QLatin1String::QLatin1String(&local_6260,"CMAKE_LIBRARY_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5018,&local_6249,&local_6260);
  local_6261 = 'C';
  QLatin1String::QLatin1String(&local_6278,"CMAKE_MFC_FLAG");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5000,&local_6261,&local_6278);
  local_6279 = 'C';
  QLatin1String::QLatin1String(&local_6290,"CMAKE_MODULE_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4fe8,&local_6279,&local_6290);
  local_6291 = 'C';
  QLatin1String::QLatin1String(&local_62a8,"CMAKE_NOT_USING_CONFIG_FLAGS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4fd0,&local_6291,&local_62a8);
  local_62a9 = 'C';
  QLatin1String::QLatin1String(&local_62c0,"CMAKE_PREFIX_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4fb8,&local_62a9,&local_62c0);
  local_62c1 = 'C';
  QLatin1String::QLatin1String(&local_62d8,"CMAKE_PROGRAM_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4fa0,&local_62c1,&local_62d8);
  local_62d9 = 'C';
  QLatin1String::QLatin1String(&local_62f0,"CMAKE_SKIP_INSTALL_ALL_DEPENDENCY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4f88,&local_62d9,&local_62f0);
  local_62f1 = 'C';
  QLatin1String::QLatin1String(&local_6308,"CMAKE_STAGING_PREFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4f70,&local_62f1,&local_6308);
  local_6309 = 'C';
  QLatin1String::QLatin1String(&local_6320,"CMAKE_SYSTEM_IGNORE_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4f58,&local_6309,&local_6320);
  local_6321 = 'C';
  QLatin1String::QLatin1String(&local_6338,"CMAKE_SYSTEM_INCLUDE_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4f40,&local_6321,&local_6338);
  local_6339 = 'C';
  QLatin1String::QLatin1String(&local_6350,"CMAKE_SYSTEM_LIBRARY_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4f28,&local_6339,&local_6350);
  local_6351 = 'C';
  QLatin1String::QLatin1String(&local_6368,"CMAKE_SYSTEM_PREFIX_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4f10,&local_6351,&local_6368);
  local_6369 = 'C';
  QLatin1String::QLatin1String(&local_6380,"CMAKE_SYSTEM_PROGRAM_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4ef8,&local_6369,&local_6380);
  local_6381 = 'C';
  QLatin1String::QLatin1String(&local_6398,"CMAKE_USER_MAKE_RULES_OVERRIDE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4ee0,&local_6381,&local_6398);
  local_6399 = 'C';
  QLatin1String::QLatin1String(&local_63b0,"CMAKE_WARN_DEPRECATED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4ec8,&local_6399,&local_63b0);
  local_63b1 = 'C';
  QLatin1String::QLatin1String(&local_63c8,"CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4eb0,&local_63b1,&local_63c8);
  local_63c9 = 'A';
  QLatin1String::QLatin1String(&local_63e0,"APPLE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4e98,&local_63c9,&local_63e0);
  local_63e1 = 'B';
  QLatin1String::QLatin1String(&local_63f8,"BORLAND");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4e80,&local_63e1,&local_63f8);
  local_63f9 = 'C';
  QLatin1String::QLatin1String(&local_6410,"CMAKE_CL_64");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4e68,&local_63f9,&local_6410);
  local_6411 = 'C';
  QLatin1String::QLatin1String(&local_6428,"CMAKE_COMPILER_2005");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4e50,&local_6411,&local_6428);
  local_6429 = 'C';
  QLatin1String::QLatin1String(&local_6440,"CMAKE_HOST_APPLE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4e38,&local_6429,&local_6440);
  local_6441 = 'C';
  QLatin1String::QLatin1String(&local_6458,"CMAKE_HOST_SYSTEM_NAME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4e20,&local_6441,&local_6458);
  local_6459 = 'C';
  QLatin1String::QLatin1String(&local_6470,"CMAKE_HOST_SYSTEM_PROCESSOR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4e08,&local_6459,&local_6470);
  local_6471 = 'C';
  QLatin1String::QLatin1String(&local_6488,"CMAKE_HOST_SYSTEM");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4df0,&local_6471,&local_6488);
  local_6489 = 'C';
  QLatin1String::QLatin1String(&local_64a0,"CMAKE_HOST_SYSTEM_VERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4dd8,&local_6489,&local_64a0);
  local_64a1 = 'C';
  QLatin1String::QLatin1String(&local_64b8,"CMAKE_HOST_UNIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4dc0,&local_64a1,&local_64b8);
  local_64b9 = 'C';
  QLatin1String::QLatin1String(&local_64d0,"CMAKE_HOST_WIN32");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4da8,&local_64b9,&local_64d0);
  local_64d1 = 'C';
  QLatin1String::QLatin1String(&local_64e8,"CMAKE_LIBRARY_ARCHITECTURE_REGEX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4d90,&local_64d1,&local_64e8);
  local_64e9 = 'C';
  QLatin1String::QLatin1String(&local_6500,"CMAKE_LIBRARY_ARCHITECTURE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4d78,&local_64e9,&local_6500);
  local_6501 = 'C';
  QLatin1String::QLatin1String(&local_6518,"CMAKE_OBJECT_PATH_MAX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4d60,&local_6501,&local_6518);
  local_6519 = 'C';
  QLatin1String::QLatin1String(&local_6530,"CMAKE_SYSTEM_NAME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4d48,&local_6519,&local_6530);
  local_6531 = 'C';
  QLatin1String::QLatin1String(&local_6548,"CMAKE_SYSTEM_PROCESSOR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4d30,&local_6531,&local_6548);
  local_6549 = 'C';
  QLatin1String::QLatin1String(&local_6560,"CMAKE_SYSTEM");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4d18,&local_6549,&local_6560);
  local_6561 = 'C';
  QLatin1String::QLatin1String(&local_6578,"CMAKE_SYSTEM_VERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4d00,&local_6561,&local_6578);
  local_6579 = 'C';
  QLatin1String::QLatin1String(&local_6590,"CYGWIN");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4ce8,&local_6579,&local_6590);
  local_6591 = 'E';
  QLatin1String::QLatin1String(&local_65a8,"ENV");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4cd0,&local_6591,&local_65a8);
  local_65a9 = 'M';
  QLatin1String::QLatin1String(&local_65c0,"MSVC10");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4cb8,&local_65a9,&local_65c0);
  local_65c1 = 'M';
  QLatin1String::QLatin1String(&local_65d8,"MSVC11");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4ca0,&local_65c1,&local_65d8);
  local_65d9 = 'M';
  QLatin1String::QLatin1String(&local_65f0,"MSVC12");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4c88,&local_65d9,&local_65f0);
  local_65f1 = 'M';
  QLatin1String::QLatin1String(&local_6608,"MSVC60");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4c70,&local_65f1,&local_6608);
  local_6609 = 'M';
  QLatin1String::QLatin1String(&local_6620,"MSVC70");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4c58,&local_6609,&local_6620);
  local_6621 = 'M';
  QLatin1String::QLatin1String(&local_6638,"MSVC71");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4c40,&local_6621,&local_6638);
  local_6639 = 'M';
  QLatin1String::QLatin1String(&local_6650,"MSVC80");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4c28,&local_6639,&local_6650);
  local_6651 = 'M';
  QLatin1String::QLatin1String(&local_6668,"MSVC90");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4c10,&local_6651,&local_6668);
  local_6669 = 'M';
  QLatin1String::QLatin1String(&local_6680,"MSVC_IDE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4bf8,&local_6669,&local_6680);
  local_6681 = 'M';
  QLatin1String::QLatin1String(&local_6698,"MSVC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4be0,&local_6681,&local_6698);
  local_6699 = 'M';
  QLatin1String::QLatin1String(&local_66b0,"MSVC_VERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4bc8,&local_6699,&local_66b0);
  local_66b1 = 'U';
  QLatin1String::QLatin1String(&local_66c8,"UNIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4bb0,&local_66b1,&local_66c8);
  local_66c9 = 'W';
  QLatin1String::QLatin1String(&local_66e0,"WIN32");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4b98,&local_66c9,&local_66e0);
  local_66e1 = 'X';
  QLatin1String::QLatin1String(&local_66f8,"XCODE_VERSION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4b80,&local_66e1,&local_66f8);
  local_66f9 = 'C';
  QLatin1String::QLatin1String(&local_6710,"CMAKE_ARCHIVE_OUTPUT_DIRECTORY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4b68,&local_66f9,&local_6710);
  local_6711 = 'C';
  QLatin1String::QLatin1String(&local_6728,"CMAKE_AUTOMOC_MOC_OPTIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4b50,&local_6711,&local_6728);
  local_6729 = 'C';
  QLatin1String::QLatin1String(&local_6740,"CMAKE_AUTOMOC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4b38,&local_6729,&local_6740);
  local_6741 = 'C';
  QLatin1String::QLatin1String(&local_6758,"CMAKE_AUTORCC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4b20,&local_6741,&local_6758);
  local_6759 = 'C';
  QLatin1String::QLatin1String(&local_6770,"CMAKE_AUTORCC_OPTIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4b08,&local_6759,&local_6770);
  local_6771 = 'C';
  QLatin1String::QLatin1String(&local_6788,"CMAKE_AUTOUIC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4af0,&local_6771,&local_6788);
  local_6789 = 'C';
  QLatin1String::QLatin1String(&local_67a0,"CMAKE_AUTOUIC_OPTIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4ad8,&local_6789,&local_67a0);
  local_67a1 = 'C';
  QLatin1String::QLatin1String(&local_67b8,"CMAKE_BUILD_WITH_INSTALL_RPATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4ac0,&local_67a1,&local_67b8);
  local_67b9 = 'C';
  QLatin1String::QLatin1String(&local_67d0,"CMAKE_DEBUG_POSTFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4aa8,&local_67b9,&local_67d0);
  local_67d1 = 'C';
  QLatin1String::QLatin1String(&local_67e8,"CMAKE_EXE_LINKER_FLAGS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4a90,&local_67d1,&local_67e8);
  local_67e9 = 'C';
  QLatin1String::QLatin1String(&local_6800,"CMAKE_Fortran_FORMAT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4a78,&local_67e9,&local_6800);
  local_6801 = 'C';
  QLatin1String::QLatin1String(&local_6818,"CMAKE_Fortran_MODULE_DIRECTORY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4a60,&local_6801,&local_6818);
  local_6819 = 'C';
  QLatin1String::QLatin1String(&local_6830,"CMAKE_GNUtoMS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4a48,&local_6819,&local_6830);
  local_6831 = 'C';
  QLatin1String::QLatin1String(&local_6848,"CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4a30,&local_6831,&local_6848);
  local_6849 = 'C';
  QLatin1String::QLatin1String(&local_6860,"CMAKE_INCLUDE_CURRENT_DIR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4a18,&local_6849,&local_6860);
  local_6861 = 'C';
  QLatin1String::QLatin1String(&local_6878,"CMAKE_INSTALL_NAME_DIR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4a00,&local_6861,&local_6878);
  local_6879 = 'C';
  QLatin1String::QLatin1String(&local_6890,"CMAKE_INSTALL_RPATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_49e8,&local_6879,&local_6890);
  local_6891 = 'C';
  QLatin1String::QLatin1String(&local_68a8,"CMAKE_INSTALL_RPATH_USE_LINK_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_49d0,&local_6891,&local_68a8);
  local_68a9 = 'C';
  QLatin1String::QLatin1String(&local_68c0,"CMAKE_LIBRARY_OUTPUT_DIRECTORY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_49b8,&local_68a9,&local_68c0);
  local_68c1 = 'C';
  QLatin1String::QLatin1String(&local_68d8,"CMAKE_LIBRARY_PATH_FLAG");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_49a0,&local_68c1,&local_68d8);
  local_68d9 = 'C';
  QLatin1String::QLatin1String(&local_68f0,"CMAKE_LINK_DEF_FILE_FLAG");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4988,&local_68d9,&local_68f0);
  local_68f1 = 'C';
  QLatin1String::QLatin1String(&local_6908,"CMAKE_LINK_DEPENDS_NO_SHARED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4970,&local_68f1,&local_6908);
  local_6909 = 'C';
  QLatin1String::QLatin1String(&local_6920,"CMAKE_LINK_INTERFACE_LIBRARIES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4958,&local_6909,&local_6920);
  local_6921 = 'C';
  QLatin1String::QLatin1String(&local_6938,"CMAKE_LINK_LIBRARY_FILE_FLAG");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4940,&local_6921,&local_6938);
  local_6939 = 'C';
  QLatin1String::QLatin1String(&local_6950,"CMAKE_LINK_LIBRARY_FLAG");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4928,&local_6939,&local_6950);
  local_6951 = 'C';
  QLatin1String::QLatin1String(&local_6968,"CMAKE_MACOSX_BUNDLE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4910,&local_6951,&local_6968);
  local_6969 = 'C';
  QLatin1String::QLatin1String(&local_6980,"CMAKE_MACOSX_RPATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_48f8,&local_6969,&local_6980);
  local_6981 = 'C';
  QLatin1String::QLatin1String(&local_6998,"CMAKE_MODULE_LINKER_FLAGS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_48e0,&local_6981,&local_6998);
  local_6999 = 'C';
  QLatin1String::QLatin1String(&local_69b0,"CMAKE_NO_BUILTIN_CHRPATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_48c8,&local_6999,&local_69b0);
  local_69b1 = 'C';
  QLatin1String::QLatin1String(&local_69c8,"CMAKE_NO_SYSTEM_FROM_IMPORTED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_48b0,&local_69b1,&local_69c8);
  local_69c9 = 'C';
  QLatin1String::QLatin1String(&local_69e0,"CMAKE_OSX_ARCHITECTURES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4898,&local_69c9,&local_69e0);
  local_69e1 = 'C';
  QLatin1String::QLatin1String(&local_69f8,"CMAKE_OSX_DEPLOYMENT_TARGET");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4880,&local_69e1,&local_69f8);
  local_69f9 = 'C';
  QLatin1String::QLatin1String(&local_6a10,"CMAKE_OSX_SYSROOT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4868,&local_69f9,&local_6a10);
  local_6a11 = 'C';
  QLatin1String::QLatin1String(&local_6a28,"CMAKE_PDB_OUTPUT_DIRECTORY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4850,&local_6a11,&local_6a28);
  local_6a29 = 'C';
  QLatin1String::QLatin1String(&local_6a40,"CMAKE_POSITION_INDEPENDENT_CODE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4838,&local_6a29,&local_6a40);
  local_6a41 = 'C';
  QLatin1String::QLatin1String(&local_6a58,"CMAKE_RUNTIME_OUTPUT_DIRECTORY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4820,&local_6a41,&local_6a58);
  local_6a59 = 'C';
  QLatin1String::QLatin1String(&local_6a70,"CMAKE_SHARED_LINKER_FLAGS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4808,&local_6a59,&local_6a70);
  local_6a71 = 'C';
  QLatin1String::QLatin1String(&local_6a88,"CMAKE_SKIP_BUILD_RPATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_47f0,&local_6a71,&local_6a88);
  local_6a89 = 'C';
  QLatin1String::QLatin1String(&local_6aa0,"CMAKE_SKIP_INSTALL_RPATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_47d8,&local_6a89,&local_6aa0);
  local_6aa1 = 'C';
  QLatin1String::QLatin1String(&local_6ab8,"CMAKE_STATIC_LINKER_FLAGS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_47c0,&local_6aa1,&local_6ab8);
  local_6ab9 = 'C';
  QLatin1String::QLatin1String(&local_6ad0,"CMAKE_TRY_COMPILE_CONFIGURATION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_47a8,&local_6ab9,&local_6ad0);
  local_6ad1 = 'C';
  QLatin1String::QLatin1String(&local_6ae8,"CMAKE_USE_RELATIVE_PATHS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4790,&local_6ad1,&local_6ae8);
  local_6ae9 = 'C';
  QLatin1String::QLatin1String(&local_6b00,"CMAKE_VISIBILITY_INLINES_HIDDEN");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4778,&local_6ae9,&local_6b00);
  local_6b01 = 'C';
  QLatin1String::QLatin1String(&local_6b18,"CMAKE_WIN32_EXECUTABLE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4760,&local_6b01,&local_6b18);
  local_6b19 = 'E';
  QLatin1String::QLatin1String(&local_6b30,"EXECUTABLE_OUTPUT_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4748,&local_6b19,&local_6b30);
  local_6b31 = 'L';
  QLatin1String::QLatin1String(&local_6b48,"LIBRARY_OUTPUT_PATH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4730,&local_6b31,&local_6b48);
  local_6b49 = 'C';
  QLatin1String::QLatin1String(&local_6b60,"CMAKE_Fortran_MODDIR_DEFAULT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4718,&local_6b49,&local_6b60);
  local_6b61 = 'C';
  QLatin1String::QLatin1String(&local_6b78,"CMAKE_Fortran_MODDIR_FLAG");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4700,&local_6b61,&local_6b78);
  local_6b79 = 'C';
  QLatin1String::QLatin1String(&local_6b90,"CMAKE_Fortran_MODOUT_FLAG");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_46e8,&local_6b79,&local_6b90);
  local_6b91 = 'C';
  QLatin1String::QLatin1String(&local_6ba8,"CMAKE_INTERNAL_PLATFORM_ABI");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_46d0,&local_6b91,&local_6ba8);
  local_6ba9 = 'C';
  QLatin1String::QLatin1String(&local_6bc0,"CPACK_ABSOLUTE_DESTINATION_FILES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_46b8,&local_6ba9,&local_6bc0);
  local_6bc1 = 'C';
  QLatin1String::QLatin1String(&local_6bd8,"CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_46a0,&local_6bc1,&local_6bd8);
  local_6bd9 = 'C';
  QLatin1String::QLatin1String(&local_6bf0,"CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4688,&local_6bd9,&local_6bf0);
  local_6bf1 = 'C';
  QLatin1String::QLatin1String(&local_6c08,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4670,&local_6bf1,&local_6c08);
  local_6c09 = 'C';
  QLatin1String::QLatin1String(&local_6c20,"CPACK_INSTALL_SCRIPT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4658,&local_6c09,&local_6c20);
  local_6c21 = 'C';
  QLatin1String::QLatin1String(&local_6c38,"CPACK_PACKAGING_INSTALL_PREFIX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4640,&local_6c21,&local_6c38);
  local_6c39 = 'C';
  QLatin1String::QLatin1String(&local_6c50,"CPACK_SET_DESTDIR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4628,&local_6c39,&local_6c50);
  local_6c51 = 'C';
  QLatin1String::QLatin1String(&local_6c68,"CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4610,&local_6c51,&local_6c68);
  local_45f8 = &local_5930;
  local_45f0 = 0xcd;
  list._M_len = 0xcd;
  list._M_array = local_45f8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_45e8,list);
  QMultiHash<char,_QLatin1String>::operator=(&cmake_other,&local_45e8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_45e8);
  return;
}

Assistant:

void initCMakeData() {
    cmake_keywords = {{'b', QLatin1String("break")},
                      {'c', QLatin1String("cmake_host_system_information")},
                      {'c', QLatin1String("cmake_minimum_required")},
                      {'c', QLatin1String("cmake_parse_arguments")},
                      {'c', QLatin1String("cmake_policy")},
                      {'c', QLatin1String("configure_file")},
                      {'c', QLatin1String("continue")},
                      {'e', QLatin1String("elseif")},
                      {'e', QLatin1String("else")},
                      {'e', QLatin1String("endforeach")},
                      {'e', QLatin1String("endfunction")},
                      {'e', QLatin1String("endif")},
                      {'e', QLatin1String("endmacro")},
                      {'e', QLatin1String("endwhile")},
                      {'e', QLatin1String("execute_process")},
                      {'f', QLatin1String("file")},
                      {'f', QLatin1String("find_file")},
                      {'f', QLatin1String("find_library")},
                      {'f', QLatin1String("find_package")},
                      {'f', QLatin1String("find_path")},
                      {'f', QLatin1String("find_program")},
                      {'f', QLatin1String("foreach")},
                      {'f', QLatin1String("function")},
                      {'g', QLatin1String("get_cmake_property")},
                      {'g', QLatin1String("get_directory_property")},
                      {'g', QLatin1String("get_filename_component")},
                      {'g', QLatin1String("get_property")},
                      {'i', QLatin1String("if")},
                      {'i', QLatin1String("include")},
                      {'i', QLatin1String("include_guard")},
                      {'l', QLatin1String("list")},
                      {'m', QLatin1String("macro")},
                      {'m', QLatin1String("mark_as_advanced")},
                      {'m', QLatin1String("math")},
                      {'m', QLatin1String("message")},
                      {'o', QLatin1String("option")},
                      {'r', QLatin1String("return")},
                      {'s', QLatin1String("separate_arguments")},
                      {'s', QLatin1String("set_directory_properties")},
                      {'s', QLatin1String("set")},
                      {'s', QLatin1String("set_property")},
                      {'s', QLatin1String("site_name")},
                      {'s', QLatin1String("string")},
                      {'u', QLatin1String("unset")},
                      {'v', QLatin1String("variable_watch")},
                      {'w', QLatin1String("while")},
                      {'a', QLatin1String("add_compile_definitions")},
                      {'a', QLatin1String("add_compile_options")},
                      {'A', QLatin1String("ADD_COMPILE_OPTIONS")},
                      {'a', QLatin1String("add_custom_command")},
                      {'a', QLatin1String("add_custom_target")},
                      {'a', QLatin1String("add_definitions")},
                      {'a', QLatin1String("add_dependencies")},
                      {'a', QLatin1String("add_executable")},
                      {'a', QLatin1String("add_library")},
                      {'a', QLatin1String("add_link_options")},
                      {'a', QLatin1String("add_subdirectory")},
                      {'a', QLatin1String("add_test")},
                      {'a', QLatin1String("aux_source_directory")},
                      {'b', QLatin1String("build_command")},
                      {'c', QLatin1String("create_test_sourcelist")},
                      {'d', QLatin1String("define_property")},
                      {'e', QLatin1String("enable_language")},
                      {'e', QLatin1String("enable_testing")},
                      {'e', QLatin1String("export")},
                      {'f', QLatin1String("fltk_wrap_ui")},
                      {'g', QLatin1String("get_source_file_property")},
                      {'g', QLatin1String("get_target_property")},
                      {'g', QLatin1String("get_test_property")},
                      {'i', QLatin1String("include_directories")},
                      {'i', QLatin1String("include_external_msproject")},
                      {'i', QLatin1String("include_regular_expression")},
                      {'i', QLatin1String("install")},
                      {'l', QLatin1String("link_directories")},
                      {'l', QLatin1String("link_libraries")},
                      {'l', QLatin1String("load_cache")},
                      {'p', QLatin1String("project")},
                      {'q', QLatin1String("qt_wrap_cpp")},
                      {'q', QLatin1String("qt_wrap_ui")},
                      {'r', QLatin1String("remove_definitions")},
                      {'s', QLatin1String("set_source_files_properties")},
                      {'s', QLatin1String("set_target_properties")},
                      {'s', QLatin1String("set_tests_properties")},
                      {'s', QLatin1String("source_group")},
                      {'t', QLatin1String("target_compile_definitions")},
                      {'t', QLatin1String("target_compile_features")},
                      {'t', QLatin1String("target_compile_options")},
                      {'t', QLatin1String("target_include_directories")},
                      {'t', QLatin1String("target_link_directories")},
                      {'t', QLatin1String("target_link_libraries")},
                      {'t', QLatin1String("target_link_options")},
                      {'t', QLatin1String("target_sources")},
                      {'t', QLatin1String("try_compile")},
                      {'t', QLatin1String("try_run")},
                      {'c', QLatin1String("ctest_build")},
                      {'c', QLatin1String("ctest_configure")},
                      {'c', QLatin1String("ctest_coverage")},
                      {'c', QLatin1String("ctest_empty_binary_directory")},
                      {'c', QLatin1String("ctest_memcheck")},
                      {'c', QLatin1String("ctest_read_custom_files")},
                      {'c', QLatin1String("ctest_run_script")},
                      {'c', QLatin1String("ctest_sleep")},
                      {'c', QLatin1String("ctest_start")},
                      {'c', QLatin1String("ctest_submit")},
                      {'c', QLatin1String("ctest_test")},
                      {'c', QLatin1String("ctest_update")},
                      {'c', QLatin1String("ctest_upload")},
                      {'b', QLatin1String("build_name")},
                      {'e', QLatin1String("exec_program")},
                      {'e', QLatin1String("export_library_dependencies")},
                      {'i', QLatin1String("install_files")},
                      {'i', QLatin1String("install_programs")},
                      {'i', QLatin1String("install_targets")},
                      {'l', QLatin1String("load_command")},
                      {'m', QLatin1String("make_directory")},
                      {'o', QLatin1String("output_required_files")},
                      {'r', QLatin1String("remove")},
                      {'s', QLatin1String("subdir_depends")},
                      {'s', QLatin1String("subdirs")},
                      {'u', QLatin1String("use_mangled_mesa")},
                      {'u', QLatin1String("utility_source")},
                      {'v', QLatin1String("variable_requires")},
                      {'w', QLatin1String("write_file")},
                      {'q', QLatin1String("qt5_use_modules")},
                      {'q', QLatin1String("qt5_use_package")},
                      {'q', QLatin1String("qt5_wrap_cpp")},
                      {'a', QLatin1String("and")},
                      {'o', QLatin1String("or")},
                      {'n', QLatin1String("not")},
                      {'c', QLatin1String("command")},
                      {'p', QLatin1String("policy")},
                      {'t', QLatin1String("target")},
                      {'t', QLatin1String("test")},
                      {'e', QLatin1String("exists")},
                      {'i', QLatin1String("is_newer_than")},
                      {'i', QLatin1String("is_directory")},
                      {'i', QLatin1String("is_symlink")},
                      {'i', QLatin1String("is_absolute")},
                      {'m', QLatin1String("matches")},
                      {'l', QLatin1String("less")},
                      {'g', QLatin1String("greater")},
                      {'e', QLatin1String("equal")},
                      {'l', QLatin1String("less_equal")},
                      {'g', QLatin1String("greater_equal")},
                      {'s', QLatin1String("strless")},
                      {'s', QLatin1String("strgreater")},
                      {'s', QLatin1String("strequal")},
                      {'s', QLatin1String("strless_equal")},
                      {'s', QLatin1String("strgreater_equal")},
                      {'v', QLatin1String("version_less")},
                      {'v', QLatin1String("version_greater")},
                      {'v', QLatin1String("version_equal")},
                      {'v', QLatin1String("version_less_equal")},
                      {'v', QLatin1String("version_greater_equal")},
                      {'i', QLatin1String("in_list")},
                      {'d', QLatin1String("defined")}};
    cmake_types = {};
    cmake_literals = {
        {'o', QLatin1String("on")},   {'o', QLatin1String("off")},
        {'O', QLatin1String("ON")},   {'O', QLatin1String("OFF")},
        {'t', QLatin1String("true")}, {'f', QLatin1String("false")},
        {'T', QLatin1String("TRUE")}, {'F', QLatin1String("FALSE")}};
    cmake_builtin = {
        {'A', QLatin1String("ALLOW_DUPLICATE_CUSTOM_TARGETS")},
        {'A', QLatin1String("AUTOGEN_TARGETS_FOLDER")},
        {'A', QLatin1String("AUTOMOC_TARGETS_FOLDER")},
        {'D', QLatin1String("DEBUG_CONFIGURATIONS")},
        {'D', QLatin1String("DISABLED_FEATURES")},
        {'E', QLatin1String("ENABLED_FEATURES")},
        {'E', QLatin1String("ENABLED_LANGUAGES")},
        {'F', QLatin1String("FIND_LIBRARY_USE_LIB64_PATHS")},
        {'F', QLatin1String("FIND_LIBRARY_USE_OPENBSD_VERSIONING")},
        {'G', QLatin1String("GLOBAL_DEPENDS_DEBUG_MODE")},
        {'G', QLatin1String("GLOBAL_DEPENDS_NO_CYCLES")},
        {'I', QLatin1String("IN_TRY_COMPILE")},
        {'P', QLatin1String("PACKAGES_FOUND")},
        {'P', QLatin1String("PACKAGES_NOT_FOUND")},
        {'J', QLatin1String("JOB_POOLS")},
        {'P', QLatin1String("PREDEFINED_TARGETS_FOLDER")},
        {'E', QLatin1String("ECLIPSE_EXTRA_NATURES")},
        {'R', QLatin1String("REPORT_UNDEFINED_PROPERTIES")},
        {'R', QLatin1String("RULE_LAUNCH_COMPILE")},
        {'R', QLatin1String("RULE_LAUNCH_CUSTOM")},
        {'R', QLatin1String("RULE_LAUNCH_LINK")},
        {'R', QLatin1String("RULE_MESSAGES")},
        {'T', QLatin1String("TARGET_ARCHIVES_MAY_BE_SHARED_LIBS")},
        {'T', QLatin1String("TARGET_SUPPORTS_SHARED_LIBS")},
        {'U', QLatin1String("USE_FOLDERS")},
        {'A', QLatin1String("ADDITIONAL_MAKE_CLEAN_FILES")},
        {'C', QLatin1String("CACHE_VARIABLES")},
        {'C', QLatin1String("CLEAN_NO_CUSTOM")},
        {'C', QLatin1String("CMAKE_CONFIGURE_DEPENDS")},
        {'C', QLatin1String("COMPILE_DEFINITIONS")},
        {'C', QLatin1String("COMPILE_OPTIONS")},
        {'D', QLatin1String("DEFINITIONS")},
        {'E', QLatin1String("EXCLUDE_FROM_ALL")},
        {'I', QLatin1String("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")},
        {'I', QLatin1String("INCLUDE_DIRECTORIES")},
        {'I', QLatin1String("INCLUDE_REGULAR_EXPRESSION")},
        {'I', QLatin1String("INTERPROCEDURAL_OPTIMIZATION")},
        {'L', QLatin1String("LINK_DIRECTORIES")},
        {'L', QLatin1String("LISTFILE_STACK")},
        {'M', QLatin1String("MACROS")},
        {'P', QLatin1String("PARENT_DIRECTORY")},
        {'R', QLatin1String("RULE_LAUNCH_COMPILE")},
        {'R', QLatin1String("RULE_LAUNCH_CUSTOM")},
        {'R', QLatin1String("RULE_LAUNCH_LINK")},
        {'T', QLatin1String("TEST_INCLUDE_FILE")},
        {'V', QLatin1String("VARIABLES")},
        {'A', QLatin1String("ALIASED_TARGET")},
        {'A', QLatin1String("ARCHIVE_OUTPUT_DIRECTORY")},
        {'A', QLatin1String("ARCHIVE_OUTPUT_NAME")},
        {'A', QLatin1String("AUTOGEN_TARGET_DEPENDS")},
        {'A', QLatin1String("AUTOMOC_MOC_OPTIONS")},
        {'A', QLatin1String("AUTOMOC")},
        {'A', QLatin1String("AUTOUIC")},
        {'A', QLatin1String("AUTOUIC_OPTIONS")},
        {'A', QLatin1String("AUTORCC")},
        {'A', QLatin1String("AUTORCC_OPTIONS")},
        {'B', QLatin1String("BUILD_WITH_INSTALL_RPATH")},
        {'B', QLatin1String("BUNDLE_EXTENSION")},
        {'B', QLatin1String("BUNDLE")},
        {'C', QLatin1String("COMPATIBLE_INTERFACE_BOOL")},
        {'C', QLatin1String("COMPATIBLE_INTERFACE_NUMBER_MAX")},
        {'C', QLatin1String("COMPATIBLE_INTERFACE_NUMBER_MIN")},
        {'C', QLatin1String("COMPATIBLE_INTERFACE_STRING")},
        {'C', QLatin1String("COMPILE_DEFINITIONS")},
        {'C', QLatin1String("COMPILE_FLAGS")},
        {'C', QLatin1String("COMPILE_OPTIONS")},
        {'D', QLatin1String("DEBUG_POSTFIX")},
        {'D', QLatin1String("DEFINE_SYMBOL")},
        {'E', QLatin1String("EchoString")},
        {'E', QLatin1String("ENABLE_EXPORTS")},
        {'E', QLatin1String("EXCLUDE_FROM_ALL")},
        {'E', QLatin1String("EXCLUDE_FROM_DEFAULT_BUILD")},
        {'E', QLatin1String("EXPORT_NAME")},
        {'F', QLatin1String("FOLDER")},
        {'F', QLatin1String("Fortran_FORMAT")},
        {'F', QLatin1String("Fortran_MODULE_DIRECTORY")},
        {'F', QLatin1String("FRAMEWORK")},
        {'G', QLatin1String("GENERATOR_FILE_NAME")},
        {'G', QLatin1String("GNUtoMS")},
        {'H', QLatin1String("HAS_CXX")},
        {'I', QLatin1String("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")},
        {'I', QLatin1String("IMPORTED_CONFIGURATIONS")},
        {'I', QLatin1String("IMPORTED_IMPLIB")},
        {'I', QLatin1String("IMPORTED_LINK_DEPENDENT_LIBRARIES")},
        {'I', QLatin1String("IMPORTED_LINK_INTERFACE_LANGUAGES")},
        {'I', QLatin1String("IMPORTED_LINK_INTERFACE_LIBRARIES")},
        {'I', QLatin1String("IMPORTED_LINK_INTERFACE_MULTIPLICITY")},
        {'I', QLatin1String("IMPORTED_LOCATION")},
        {'I', QLatin1String("IMPORTED_NO_SONAME")},
        {'I', QLatin1String("IMPORTED")},
        {'I', QLatin1String("IMPORTED_SONAME")},
        {'I', QLatin1String("IMPORT_PREFIX")},
        {'I', QLatin1String("IMPORT_SUFFIX")},
        {'I', QLatin1String("INCLUDE_DIRECTORIES")},
        {'I', QLatin1String("INSTALL_NAME_DIR")},
        {'I', QLatin1String("INSTALL_RPATH")},
        {'I', QLatin1String("INSTALL_RPATH_USE_LINK_PATH")},
        {'I', QLatin1String("INTERFACE_AUTOUIC_OPTIONS")},
        {'I', QLatin1String("INTERFACE_COMPILE_DEFINITIONS")},
        {'I', QLatin1String("INTERFACE_COMPILE_OPTIONS")},
        {'I', QLatin1String("INTERFACE_INCLUDE_DIRECTORIES")},
        {'I', QLatin1String("INTERFACE_LINK_LIBRARIES")},
        {'I', QLatin1String("INTERFACE_POSITION_INDEPENDENT_CODE")},
        {'I', QLatin1String("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES")},
        {'I', QLatin1String("INTERPROCEDURAL_OPTIMIZATION")},
        {'J', QLatin1String("JOB_POOL_COMPILE")},
        {'J', QLatin1String("JOB_POOL_LINK")},
        {'L', QLatin1String("LABELS")},
        {'L', QLatin1String("LIBRARY_OUTPUT_DIRECTORY")},
        {'L', QLatin1String("LIBRARY_OUTPUT_NAME")},
        {'L', QLatin1String("LINK_DEPENDS_NO_SHARED")},
        {'L', QLatin1String("LINK_DEPENDS")},
        {'L', QLatin1String("LINKER_LANGUAGE")},
        {'L', QLatin1String("LINK_FLAGS")},
        {'L', QLatin1String("LINK_INTERFACE_LIBRARIES")},
        {'L', QLatin1String("LINK_INTERFACE_MULTIPLICITY")},
        {'L', QLatin1String("LINK_LIBRARIES")},
        {'L', QLatin1String("LINK_SEARCH_END_STATIC")},
        {'L', QLatin1String("LINK_SEARCH_START_STATIC")},
        {'L', QLatin1String("LOCATION")},
        {'M', QLatin1String("MACOSX_BUNDLE_INFO_PLIST")},
        {'M', QLatin1String("MACOSX_BUNDLE")},
        {'M', QLatin1String("MACOSX_FRAMEWORK_INFO_PLIST")},
        {'M', QLatin1String("MACOSX_RPATH")},
        //        {'N', QLatin1String("NAME")},
        {'N', QLatin1String("NO_SONAME")},
        {'N', QLatin1String("NO_SYSTEM_FROM_IMPORTED")},
        {'O', QLatin1String("OSX_ARCHITECTURES")},
        {'O', QLatin1String("OUTPUT_NAME")},
        {'P', QLatin1String("PDB_NAME")},
        {'P', QLatin1String("PDB_OUTPUT_DIRECTORY")},
        {'P', QLatin1String("POSITION_INDEPENDENT_CODE")},
        {'P', QLatin1String("POST_INSTALL_SCRIPT")},
        {'P', QLatin1String("PREFIX")},
        {'P', QLatin1String("PROPERTY")},
        {'P', QLatin1String("PRE_INSTALL_SCRIPT")},
        {'P', QLatin1String("PRIVATE_HEADER")},
        {'P', QLatin1String("PROJECT_LABEL")},
        {'P', QLatin1String("PUBLIC_HEADER")},
        {'R', QLatin1String("RESOURCE")},
        {'R', QLatin1String("RULE_LAUNCH_COMPILE")},
        {'R', QLatin1String("RULE_LAUNCH_CUSTOM")},
        {'R', QLatin1String("RULE_LAUNCH_LINK")},
        {'R', QLatin1String("RUNTIME_OUTPUT_DIRECTORY")},
        {'R', QLatin1String("RUNTIME_OUTPUT_NAME")},
        {'S', QLatin1String("SKIP_BUILD_RPATH")},
        {'S', QLatin1String("SOURCES")},
        {'S', QLatin1String("SOVERSION")},
        {'S', QLatin1String("STATIC_LIBRARY_FLAGS")},
        {'S', QLatin1String("SUFFIX")},
        {'T', QLatin1String("TARGET")},
        {'T', QLatin1String("TYPE")},
        {'V', QLatin1String("VERSION")},
        {'V', QLatin1String("VISIBILITY_INLINES_HIDDEN")},
        {'V', QLatin1String("VS_DOTNET_REFERENCES")},
        {'V', QLatin1String("VS_DOTNET_TARGET_FRAMEWORK_VERSION")},
        {'V', QLatin1String("VS_GLOBAL_KEYWORD")},
        {'V', QLatin1String("VS_GLOBAL_PROJECT_TYPES")},
        {'V', QLatin1String("VS_GLOBAL_ROOTNAMESPACE")},
        {'V', QLatin1String("VS_KEYWORD")},
        {'V', QLatin1String("VS_SCC_AUXPATH")},
        {'V', QLatin1String("VS_SCC_LOCALPATH")},
        {'V', QLatin1String("VS_SCC_PROJECTNAME")},
        {'V', QLatin1String("VS_SCC_PROVIDER")},
        {'V', QLatin1String("VS_WINRT_EXTENSIONS")},
        {'V', QLatin1String("VS_WINRT_REFERENCES")},
        {'W', QLatin1String("WIN32_EXECUTABLE")},
        {'A', QLatin1String("ATTACHED_FILES_ON_FAIL")},
        {'A', QLatin1String("ATTACHED_FILES")},
        {'C', QLatin1String("COST")},
        {'D', QLatin1String("DEPENDS")},
        {'E', QLatin1String("ENVIRONMENT")},
        {'F', QLatin1String("FAIL_REGULAR_EXPRESSION")},
        {'L', QLatin1String("LABELS")},
        {'M', QLatin1String("MEASUREMENT")},
        {'P', QLatin1String("PASS_REGULAR_EXPRESSION")},
        {'P', QLatin1String("PROCESSORS")},
        {'R', QLatin1String("REQUIRED_FILES")},
        {'R', QLatin1String("RESOURCE_LOCK")},
        {'R', QLatin1String("RUN_SERIAL")},
        {'S', QLatin1String("SKIP_RETURN_CODE")},
        {'T', QLatin1String("TIMEOUT")},
        {'W', QLatin1String("WILL_FAIL")},
        {'W', QLatin1String("WORKING_DIRECTORY")},
        {'A', QLatin1String("ABSTRACT")},
        {'A', QLatin1String("AUTOUIC_OPTIONS")},
        {'A', QLatin1String("AUTORCC_OPTIONS")},
        {'C', QLatin1String("COMPILE_DEFINITIONS")},
        {'C', QLatin1String("COMPILE_FLAGS")},
        {'E', QLatin1String("EXTERNAL_OBJECT")},
        {'F', QLatin1String("Fortran_FORMAT")},
        {'G', QLatin1String("GENERATED")},
        {'H', QLatin1String("HEADER_FILE_ONLY")},
        {'K', QLatin1String("KEEP_EXTENSION")},
        {'L', QLatin1String("LABELS")},
        //        {'L', QLatin1String("LANGUAGE")},
        {'L', QLatin1String("LOCATION")},
        {'M', QLatin1String("MACOSX_PACKAGE_LOCATION")},
        {'O', QLatin1String("OBJECT_DEPENDS")},
        {'O', QLatin1String("OBJECT_OUTPUTS")},
        {'S', QLatin1String("SYMBOLIC")},
        {'W', QLatin1String("WRAP_EXCLUDE")},
        {'A', QLatin1String("ADVANCED")},
        {'H', QLatin1String("HELPSTRING")},
        {'M', QLatin1String("MODIFIED")},
        {'S', QLatin1String("STRINGS")},
        {'T', QLatin1String("TYPE")},
        {'V', QLatin1String("VALUE")}};
    cmake_other = {
        {'C', QLatin1String("CMAKE_ARGC")},
        {'C', QLatin1String("CMAKE_ARGV0")},
        {'C', QLatin1String("CMAKE_AR")},
        {'C', QLatin1String("CMAKE_BINARY_DIR")},
        {'C', QLatin1String("CMAKE_BUILD_TOOL")},
        {'C', QLatin1String("CMAKE_CACHEFILE_DIR")},
        {'C', QLatin1String("CMAKE_CACHE_MAJOR_VERSION")},
        {'C', QLatin1String("CMAKE_CACHE_MINOR_VERSION")},
        {'C', QLatin1String("CMAKE_CACHE_PATCH_VERSION")},
        {'C', QLatin1String("CMAKE_CFG_INTDIR")},
        {'C', QLatin1String("CMAKE_COMMAND")},
        {'C', QLatin1String("CMAKE_CROSSCOMPILING")},
        {'C', QLatin1String("CMAKE_CTEST_COMMAND")},
        {'C', QLatin1String("CMAKE_CURRENT_BINARY_DIR")},
        {'C', QLatin1String("CMAKE_CURRENT_LIST_DIR")},
        {'C', QLatin1String("CMAKE_CURRENT_LIST_FILE")},
        {'C', QLatin1String("CMAKE_CURRENT_LIST_LINE")},
        {'C', QLatin1String("CMAKE_CURRENT_SOURCE_DIR")},
        {'C', QLatin1String("CMAKE_DL_LIBS")},
        {'C', QLatin1String("CMAKE_EDIT_COMMAND")},
        {'C', QLatin1String("CMAKE_EXECUTABLE_SUFFIX")},
        {'C', QLatin1String("CMAKE_EXTRA_GENERATOR")},
        {'C', QLatin1String("CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES")},
        {'C', QLatin1String("CMAKE_GENERATOR")},
        {'C', QLatin1String("CMAKE_GENERATOR_TOOLSET")},
        {'C', QLatin1String("CMAKE_HOME_DIRECTORY")},
        {'C', QLatin1String("CMAKE_IMPORT_LIBRARY_PREFIX")},
        {'C', QLatin1String("CMAKE_IMPORT_LIBRARY_SUFFIX")},
        {'C', QLatin1String("CMAKE_JOB_POOL_COMPILE")},
        {'C', QLatin1String("CMAKE_JOB_POOL_LINK")},
        {'C', QLatin1String("CMAKE_LINK_LIBRARY_SUFFIX")},
        {'C', QLatin1String("CMAKE_MAJOR_VERSION")},
        {'C', QLatin1String("CMAKE_MAKE_PROGRAM")},
        {'C', QLatin1String("CMAKE_MINIMUM_REQUIRED_VERSION")},
        {'C', QLatin1String("CMAKE_MINOR_VERSION")},
        {'C', QLatin1String("CMAKE_PARENT_LIST_FILE")},
        {'C', QLatin1String("CMAKE_PATCH_VERSION")},
        {'C', QLatin1String("CMAKE_PROJECT_NAME")},
        {'C', QLatin1String("CMAKE_RANLIB")},
        {'C', QLatin1String("CMAKE_ROOT")},
        {'C', QLatin1String("CMAKE_SCRIPT_MODE_FILE")},
        {'C', QLatin1String("CMAKE_SHARED_LIBRARY_PREFIX")},
        {'C', QLatin1String("CMAKE_SHARED_LIBRARY_SUFFIX")},
        {'C', QLatin1String("CMAKE_SHARED_MODULE_PREFIX")},
        {'C', QLatin1String("CMAKE_SHARED_MODULE_SUFFIX")},
        {'C', QLatin1String("CMAKE_SIZEOF_VOID_P")},
        {'C', QLatin1String("CMAKE_SKIP_INSTALL_RULES")},
        {'C', QLatin1String("CMAKE_SKIP_RPATH")},
        {'C', QLatin1String("CMAKE_SOURCE_DIR")},
        {'C', QLatin1String("CMAKE_STANDARD_LIBRARIES")},
        {'C', QLatin1String("CMAKE_STATIC_LIBRARY_PREFIX")},
        {'C', QLatin1String("CMAKE_STATIC_LIBRARY_SUFFIX")},
        {'C', QLatin1String("CMAKE_TOOLCHAIN_FILE")},
        {'C', QLatin1String("CMAKE_TWEAK_VERSION")},
        {'C', QLatin1String("CMAKE_VERBOSE_MAKEFILE")},
        {'C', QLatin1String("CMAKE_VERSION")},
        {'C', QLatin1String("CMAKE_VS_DEVENV_COMMAND")},
        {'C', QLatin1String("CMAKE_VS_INTEL_Fortran_PROJECT_VERSION")},
        {'C', QLatin1String("CMAKE_VS_MSBUILD_COMMAND")},
        {'C', QLatin1String("CMAKE_VS_MSDEV_COMMAND")},
        {'C', QLatin1String("CMAKE_VS_PLATFORM_TOOLSET")},
        {'C', QLatin1String("CMAKE_XCODE_PLATFORM_TOOLSET")},
        {'P', QLatin1String("PROJECT_BINARY_DIR")},
        //        {'P', QLatin1String("PROJECT_NAME")},
        {'P', QLatin1String("PROJECT_SOURCE_DIR")},
        {'P', QLatin1String("PROJECT_VERSION")},
        {'P', QLatin1String("PROJECT_VERSION_MAJOR")},
        {'P', QLatin1String("PROJECT_VERSION_MINOR")},
        {'P', QLatin1String("PROJECT_VERSION_PATCH")},
        {'P', QLatin1String("PROJECT_VERSION_TWEAK")},
        {'B', QLatin1String("BUILD_SHARED_LIBS")},
        {'C', QLatin1String("CMAKE_ABSOLUTE_DESTINATION_FILES")},
        {'C', QLatin1String("CMAKE_APPBUNDLE_PATH")},
        {'C', QLatin1String("CMAKE_AUTOMOC_RELAXED_MODE")},
        {'C', QLatin1String("CMAKE_BACKWARDS_COMPATIBILITY")},
        {'C', QLatin1String("CMAKE_BUILD_TYPE")},
        {'C', QLatin1String("CMAKE_COLOR_MAKEFILE")},
        {'C', QLatin1String("CMAKE_CONFIGURATION_TYPES")},
        {'C', QLatin1String("CMAKE_DEBUG_TARGET_PROPERTIES")},
        {'C', QLatin1String("CMAKE_ERROR_DEPRECATED")},
        {'C', QLatin1String("CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION")},
        {'C', QLatin1String("CMAKE_SYSROOT")},
        {'C', QLatin1String("CMAKE_FIND_LIBRARY_PREFIXES")},
        {'C', QLatin1String("CMAKE_FIND_LIBRARY_SUFFIXES")},
        {'C', QLatin1String("CMAKE_FIND_NO_INSTALL_PREFIX")},
        {'C', QLatin1String("CMAKE_FIND_PACKAGE_WARN_NO_MODULE")},
        {'C', QLatin1String("CMAKE_FIND_ROOT_PATH")},
        {'C', QLatin1String("CMAKE_FIND_ROOT_PATH_MODE_INCLUDE")},
        {'C', QLatin1String("CMAKE_FIND_ROOT_PATH_MODE_LIBRARY")},
        {'C', QLatin1String("CMAKE_FIND_ROOT_PATH_MODE_PACKAGE")},
        {'C', QLatin1String("CMAKE_FIND_ROOT_PATH_MODE_PROGRAM")},
        {'C', QLatin1String("CMAKE_FRAMEWORK_PATH")},
        {'C', QLatin1String("CMAKE_IGNORE_PATH")},
        {'C', QLatin1String("CMAKE_INCLUDE_PATH")},
        {'C', QLatin1String("CMAKE_INCLUDE_DIRECTORIES_BEFORE")},
        {'C', QLatin1String("CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE")},
        {'C', QLatin1String("CMAKE_INSTALL_DEFAULT_COMPONENT_NAME")},
        {'C', QLatin1String("CMAKE_INSTALL_PREFIX")},
        {'C', QLatin1String("CMAKE_LIBRARY_PATH")},
        {'C', QLatin1String("CMAKE_MFC_FLAG")},
        {'C', QLatin1String("CMAKE_MODULE_PATH")},
        {'C', QLatin1String("CMAKE_NOT_USING_CONFIG_FLAGS")},
        {'C', QLatin1String("CMAKE_PREFIX_PATH")},
        {'C', QLatin1String("CMAKE_PROGRAM_PATH")},
        {'C', QLatin1String("CMAKE_SKIP_INSTALL_ALL_DEPENDENCY")},
        {'C', QLatin1String("CMAKE_STAGING_PREFIX")},
        {'C', QLatin1String("CMAKE_SYSTEM_IGNORE_PATH")},
        {'C', QLatin1String("CMAKE_SYSTEM_INCLUDE_PATH")},
        {'C', QLatin1String("CMAKE_SYSTEM_LIBRARY_PATH")},
        {'C', QLatin1String("CMAKE_SYSTEM_PREFIX_PATH")},
        {'C', QLatin1String("CMAKE_SYSTEM_PROGRAM_PATH")},
        {'C', QLatin1String("CMAKE_USER_MAKE_RULES_OVERRIDE")},
        {'C', QLatin1String("CMAKE_WARN_DEPRECATED")},
        {'C', QLatin1String("CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION")},
        {'A', QLatin1String("APPLE")},
        {'B', QLatin1String("BORLAND")},
        {'C', QLatin1String("CMAKE_CL_64")},
        {'C', QLatin1String("CMAKE_COMPILER_2005")},
        {'C', QLatin1String("CMAKE_HOST_APPLE")},
        {'C', QLatin1String("CMAKE_HOST_SYSTEM_NAME")},
        {'C', QLatin1String("CMAKE_HOST_SYSTEM_PROCESSOR")},
        {'C', QLatin1String("CMAKE_HOST_SYSTEM")},
        {'C', QLatin1String("CMAKE_HOST_SYSTEM_VERSION")},
        {'C', QLatin1String("CMAKE_HOST_UNIX")},
        {'C', QLatin1String("CMAKE_HOST_WIN32")},
        {'C', QLatin1String("CMAKE_LIBRARY_ARCHITECTURE_REGEX")},
        {'C', QLatin1String("CMAKE_LIBRARY_ARCHITECTURE")},
        {'C', QLatin1String("CMAKE_OBJECT_PATH_MAX")},
        {'C', QLatin1String("CMAKE_SYSTEM_NAME")},
        {'C', QLatin1String("CMAKE_SYSTEM_PROCESSOR")},
        {'C', QLatin1String("CMAKE_SYSTEM")},
        {'C', QLatin1String("CMAKE_SYSTEM_VERSION")},
        {'C', QLatin1String("CYGWIN")},
        {'E', QLatin1String("ENV")},
        {'M', QLatin1String("MSVC10")},
        {'M', QLatin1String("MSVC11")},
        {'M', QLatin1String("MSVC12")},
        {'M', QLatin1String("MSVC60")},
        {'M', QLatin1String("MSVC70")},
        {'M', QLatin1String("MSVC71")},
        {'M', QLatin1String("MSVC80")},
        {'M', QLatin1String("MSVC90")},
        {'M', QLatin1String("MSVC_IDE")},
        {'M', QLatin1String("MSVC")},
        {'M', QLatin1String("MSVC_VERSION")},
        {'U', QLatin1String("UNIX")},
        {'W', QLatin1String("WIN32")},
        {'X', QLatin1String("XCODE_VERSION")},
        {'C', QLatin1String("CMAKE_ARCHIVE_OUTPUT_DIRECTORY")},
        {'C', QLatin1String("CMAKE_AUTOMOC_MOC_OPTIONS")},
        {'C', QLatin1String("CMAKE_AUTOMOC")},
        {'C', QLatin1String("CMAKE_AUTORCC")},
        {'C', QLatin1String("CMAKE_AUTORCC_OPTIONS")},
        {'C', QLatin1String("CMAKE_AUTOUIC")},
        {'C', QLatin1String("CMAKE_AUTOUIC_OPTIONS")},
        {'C', QLatin1String("CMAKE_BUILD_WITH_INSTALL_RPATH")},
        {'C', QLatin1String("CMAKE_DEBUG_POSTFIX")},
        {'C', QLatin1String("CMAKE_EXE_LINKER_FLAGS")},
        {'C', QLatin1String("CMAKE_Fortran_FORMAT")},
        {'C', QLatin1String("CMAKE_Fortran_MODULE_DIRECTORY")},
        {'C', QLatin1String("CMAKE_GNUtoMS")},
        {'C', QLatin1String("CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE")},
        {'C', QLatin1String("CMAKE_INCLUDE_CURRENT_DIR")},
        {'C', QLatin1String("CMAKE_INSTALL_NAME_DIR")},
        {'C', QLatin1String("CMAKE_INSTALL_RPATH")},
        {'C', QLatin1String("CMAKE_INSTALL_RPATH_USE_LINK_PATH")},
        {'C', QLatin1String("CMAKE_LIBRARY_OUTPUT_DIRECTORY")},
        {'C', QLatin1String("CMAKE_LIBRARY_PATH_FLAG")},
        {'C', QLatin1String("CMAKE_LINK_DEF_FILE_FLAG")},
        {'C', QLatin1String("CMAKE_LINK_DEPENDS_NO_SHARED")},
        {'C', QLatin1String("CMAKE_LINK_INTERFACE_LIBRARIES")},
        {'C', QLatin1String("CMAKE_LINK_LIBRARY_FILE_FLAG")},
        {'C', QLatin1String("CMAKE_LINK_LIBRARY_FLAG")},
        {'C', QLatin1String("CMAKE_MACOSX_BUNDLE")},
        {'C', QLatin1String("CMAKE_MACOSX_RPATH")},
        {'C', QLatin1String("CMAKE_MODULE_LINKER_FLAGS")},
        {'C', QLatin1String("CMAKE_NO_BUILTIN_CHRPATH")},
        {'C', QLatin1String("CMAKE_NO_SYSTEM_FROM_IMPORTED")},
        {'C', QLatin1String("CMAKE_OSX_ARCHITECTURES")},
        {'C', QLatin1String("CMAKE_OSX_DEPLOYMENT_TARGET")},
        {'C', QLatin1String("CMAKE_OSX_SYSROOT")},
        {'C', QLatin1String("CMAKE_PDB_OUTPUT_DIRECTORY")},
        {'C', QLatin1String("CMAKE_POSITION_INDEPENDENT_CODE")},
        {'C', QLatin1String("CMAKE_RUNTIME_OUTPUT_DIRECTORY")},
        {'C', QLatin1String("CMAKE_SHARED_LINKER_FLAGS")},
        {'C', QLatin1String("CMAKE_SKIP_BUILD_RPATH")},
        {'C', QLatin1String("CMAKE_SKIP_INSTALL_RPATH")},
        {'C', QLatin1String("CMAKE_STATIC_LINKER_FLAGS")},
        {'C', QLatin1String("CMAKE_TRY_COMPILE_CONFIGURATION")},
        {'C', QLatin1String("CMAKE_USE_RELATIVE_PATHS")},
        {'C', QLatin1String("CMAKE_VISIBILITY_INLINES_HIDDEN")},
        {'C', QLatin1String("CMAKE_WIN32_EXECUTABLE")},
        {'E', QLatin1String("EXECUTABLE_OUTPUT_PATH")},
        {'L', QLatin1String("LIBRARY_OUTPUT_PATH")},
        {'C', QLatin1String("CMAKE_Fortran_MODDIR_DEFAULT")},
        {'C', QLatin1String("CMAKE_Fortran_MODDIR_FLAG")},
        {'C', QLatin1String("CMAKE_Fortran_MODOUT_FLAG")},
        {'C', QLatin1String("CMAKE_INTERNAL_PLATFORM_ABI")},
        {'C', QLatin1String("CPACK_ABSOLUTE_DESTINATION_FILES")},
        {'C', QLatin1String("CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY")},
        {'C', QLatin1String("CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION")},
        {'C', QLatin1String("CPACK_INCLUDE_TOPLEVEL_DIRECTORY")},
        {'C', QLatin1String("CPACK_INSTALL_SCRIPT")},
        {'C', QLatin1String("CPACK_PACKAGING_INSTALL_PREFIX")},
        {'C', QLatin1String("CPACK_SET_DESTDIR")},
        {'C', QLatin1String("CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION")}};
}